

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  byte bVar58;
  ulong uVar59;
  long lVar60;
  byte bVar61;
  byte bVar62;
  ulong uVar63;
  byte bVar64;
  int iVar65;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  Primitive *pPVar66;
  uint uVar67;
  bool bVar68;
  bool bVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar142;
  uint uVar143;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  uint uVar144;
  uint uVar148;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float pp;
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar158 [32];
  float fVar166;
  float fVar168;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar172;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar173 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar231;
  float fVar232;
  undefined1 auVar228 [32];
  undefined1 auVar222 [16];
  undefined1 auVar229 [32];
  undefined1 auVar227 [16];
  undefined1 auVar230 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar241;
  undefined1 auVar244 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar245 [64];
  undefined1 auVar246 [32];
  undefined1 auVar249 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [64];
  float fVar251;
  float fVar257;
  undefined1 auVar253 [32];
  undefined1 auVar252 [16];
  float fVar255;
  float fVar256;
  undefined1 auVar254 [64];
  undefined1 auVar258 [16];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [28];
  float fVar262;
  undefined1 auVar263 [64];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [64];
  undefined1 auVar267 [32];
  float fVar268;
  float fVar269;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  Primitive *local_658;
  Primitive *local_650;
  ulong local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  RTCHitN local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar2 = prim[1];
  uVar70 = (ulong)(byte)PVar2;
  lVar60 = uVar70 * 0x19;
  fVar251 = *(float *)(prim + lVar60 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar81 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar78 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + lVar60 + 6));
  fVar217 = fVar251 * auVar78._0_4_;
  fVar149 = fVar251 * auVar81._0_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar89 = vpmovsxbd_avx2(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar87 = vpmovsxbd_avx2(auVar14);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar75);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar91 = vpmovsxbd_avx2(auVar76);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar96 = vpmovsxbd_avx2(auVar73);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar92 = vcvtdq2ps_avx(auVar96);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar70 + 6);
  auVar88 = vpmovsxbd_avx2(auVar1);
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar59 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar59 + 6);
  auVar93 = vpmovsxbd_avx2(auVar77);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar59 + uVar70 + 6);
  auVar94 = vpmovsxbd_avx2(auVar74);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar63 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + uVar63 + 6);
  auVar86 = vpmovsxbd_avx2(auVar233);
  auVar95 = vcvtdq2ps_avx(auVar86);
  auVar106._4_4_ = fVar149;
  auVar106._0_4_ = fVar149;
  auVar106._8_4_ = fVar149;
  auVar106._12_4_ = fVar149;
  auVar106._16_4_ = fVar149;
  auVar106._20_4_ = fVar149;
  auVar106._24_4_ = fVar149;
  auVar106._28_4_ = fVar149;
  auVar108._8_4_ = 1;
  auVar108._0_8_ = 0x100000001;
  auVar108._12_4_ = 1;
  auVar108._16_4_ = 1;
  auVar108._20_4_ = 1;
  auVar108._24_4_ = 1;
  auVar108._28_4_ = 1;
  auVar84 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar98 = ZEXT1632(CONCAT412(fVar251 * auVar81._12_4_,
                               CONCAT48(fVar251 * auVar81._8_4_,
                                        CONCAT44(fVar251 * auVar81._4_4_,fVar149))));
  auVar97 = vpermps_avx2(auVar108,auVar98);
  auVar85 = vpermps_avx512vl(auVar84,auVar98);
  fVar149 = auVar85._0_4_;
  fVar165 = auVar85._4_4_;
  auVar98._4_4_ = fVar165 * auVar90._4_4_;
  auVar98._0_4_ = fVar149 * auVar90._0_4_;
  fVar255 = auVar85._8_4_;
  auVar98._8_4_ = fVar255 * auVar90._8_4_;
  fVar256 = auVar85._12_4_;
  auVar98._12_4_ = fVar256 * auVar90._12_4_;
  fVar257 = auVar85._16_4_;
  auVar98._16_4_ = fVar257 * auVar90._16_4_;
  fVar231 = auVar85._20_4_;
  auVar98._20_4_ = fVar231 * auVar90._20_4_;
  fVar232 = auVar85._24_4_;
  auVar98._24_4_ = fVar232 * auVar90._24_4_;
  auVar98._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar88._4_4_ * fVar165;
  auVar96._0_4_ = auVar88._0_4_ * fVar149;
  auVar96._8_4_ = auVar88._8_4_ * fVar255;
  auVar96._12_4_ = auVar88._12_4_ * fVar256;
  auVar96._16_4_ = auVar88._16_4_ * fVar257;
  auVar96._20_4_ = auVar88._20_4_ * fVar231;
  auVar96._24_4_ = auVar88._24_4_ * fVar232;
  auVar96._28_4_ = auVar86._28_4_;
  auVar86._4_4_ = auVar95._4_4_ * fVar165;
  auVar86._0_4_ = auVar95._0_4_ * fVar149;
  auVar86._8_4_ = auVar95._8_4_ * fVar255;
  auVar86._12_4_ = auVar95._12_4_ * fVar256;
  auVar86._16_4_ = auVar95._16_4_ * fVar257;
  auVar86._20_4_ = auVar95._20_4_ * fVar231;
  auVar86._24_4_ = auVar95._24_4_ * fVar232;
  auVar86._28_4_ = auVar85._28_4_;
  auVar13 = vfmadd231ps_fma(auVar98,auVar97,auVar87);
  auVar14 = vfmadd231ps_fma(auVar96,auVar97,auVar92);
  auVar75 = vfmadd231ps_fma(auVar86,auVar94,auVar97);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar106,auVar89);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar106,auVar91);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar93,auVar106);
  auVar107._4_4_ = fVar217;
  auVar107._0_4_ = fVar217;
  auVar107._8_4_ = fVar217;
  auVar107._12_4_ = fVar217;
  auVar107._16_4_ = fVar217;
  auVar107._20_4_ = fVar217;
  auVar107._24_4_ = fVar217;
  auVar107._28_4_ = fVar217;
  auVar86 = ZEXT1632(CONCAT412(fVar251 * auVar78._12_4_,
                               CONCAT48(fVar251 * auVar78._8_4_,
                                        CONCAT44(fVar251 * auVar78._4_4_,fVar217))));
  auVar96 = vpermps_avx2(auVar108,auVar86);
  auVar86 = vpermps_avx512vl(auVar84,auVar86);
  fVar251 = auVar86._0_4_;
  fVar149 = auVar86._4_4_;
  auVar97._4_4_ = fVar149 * auVar90._4_4_;
  auVar97._0_4_ = fVar251 * auVar90._0_4_;
  fVar165 = auVar86._8_4_;
  auVar97._8_4_ = fVar165 * auVar90._8_4_;
  fVar255 = auVar86._12_4_;
  auVar97._12_4_ = fVar255 * auVar90._12_4_;
  fVar256 = auVar86._16_4_;
  auVar97._16_4_ = fVar256 * auVar90._16_4_;
  fVar257 = auVar86._20_4_;
  auVar97._20_4_ = fVar257 * auVar90._20_4_;
  fVar231 = auVar86._24_4_;
  auVar97._24_4_ = fVar231 * auVar90._24_4_;
  auVar97._28_4_ = 1;
  auVar84._4_4_ = auVar88._4_4_ * fVar149;
  auVar84._0_4_ = auVar88._0_4_ * fVar251;
  auVar84._8_4_ = auVar88._8_4_ * fVar165;
  auVar84._12_4_ = auVar88._12_4_ * fVar255;
  auVar84._16_4_ = auVar88._16_4_ * fVar256;
  auVar84._20_4_ = auVar88._20_4_ * fVar257;
  auVar84._24_4_ = auVar88._24_4_ * fVar231;
  auVar84._28_4_ = auVar90._28_4_;
  auVar88._4_4_ = auVar95._4_4_ * fVar149;
  auVar88._0_4_ = auVar95._0_4_ * fVar251;
  auVar88._8_4_ = auVar95._8_4_ * fVar165;
  auVar88._12_4_ = auVar95._12_4_ * fVar255;
  auVar88._16_4_ = auVar95._16_4_ * fVar256;
  auVar88._20_4_ = auVar95._20_4_ * fVar257;
  auVar88._24_4_ = auVar95._24_4_ * fVar231;
  auVar88._28_4_ = auVar86._28_4_;
  auVar76 = vfmadd231ps_fma(auVar97,auVar96,auVar87);
  auVar73 = vfmadd231ps_fma(auVar84,auVar96,auVar92);
  auVar1 = vfmadd231ps_fma(auVar88,auVar96,auVar94);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar107,auVar89);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar107,auVar91);
  auVar103._8_4_ = 0x7fffffff;
  auVar103._0_8_ = 0x7fffffff7fffffff;
  auVar103._12_4_ = 0x7fffffff;
  auVar103._16_4_ = 0x7fffffff;
  auVar103._20_4_ = 0x7fffffff;
  auVar103._24_4_ = 0x7fffffff;
  auVar103._28_4_ = 0x7fffffff;
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar107,auVar93);
  auVar89 = vandps_avx(ZEXT1632(auVar13),auVar103);
  auVar105._8_4_ = 0x219392ef;
  auVar105._0_8_ = 0x219392ef219392ef;
  auVar105._12_4_ = 0x219392ef;
  auVar105._16_4_ = 0x219392ef;
  auVar105._20_4_ = 0x219392ef;
  auVar105._24_4_ = 0x219392ef;
  auVar105._28_4_ = 0x219392ef;
  uVar59 = vcmpps_avx512vl(auVar89,auVar105,1);
  bVar68 = (bool)((byte)uVar59 & 1);
  auVar85._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._0_4_;
  bVar68 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._4_4_;
  bVar68 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._8_4_;
  bVar68 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar89 = vandps_avx(ZEXT1632(auVar14),auVar103);
  uVar59 = vcmpps_avx512vl(auVar89,auVar105,1);
  bVar68 = (bool)((byte)uVar59 & 1);
  auVar99._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._0_4_;
  bVar68 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._4_4_;
  bVar68 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._8_4_;
  bVar68 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar89 = vandps_avx(ZEXT1632(auVar75),auVar103);
  uVar59 = vcmpps_avx512vl(auVar89,auVar105,1);
  bVar68 = (bool)((byte)uVar59 & 1);
  auVar89._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar75._0_4_;
  bVar68 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar75._4_4_;
  bVar68 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar75._8_4_;
  bVar68 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar75._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar87 = vrcp14ps_avx512vl(auVar85);
  auVar104._8_4_ = 0x3f800000;
  auVar104._0_8_ = 0x3f8000003f800000;
  auVar104._12_4_ = 0x3f800000;
  auVar104._16_4_ = 0x3f800000;
  auVar104._20_4_ = 0x3f800000;
  auVar104._24_4_ = 0x3f800000;
  auVar104._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar85,auVar87,auVar104);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar99);
  auVar14 = vfnmadd213ps_fma(auVar99,auVar87,auVar104);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar89);
  auVar75 = vfnmadd213ps_fma(auVar89,auVar87,auVar104);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar87,auVar87);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar76));
  auVar93._4_4_ = auVar13._4_4_ * auVar89._4_4_;
  auVar93._0_4_ = auVar13._0_4_ * auVar89._0_4_;
  auVar93._8_4_ = auVar13._8_4_ * auVar89._8_4_;
  auVar93._12_4_ = auVar13._12_4_ * auVar89._12_4_;
  auVar93._16_4_ = auVar89._16_4_ * 0.0;
  auVar93._20_4_ = auVar89._20_4_ * 0.0;
  auVar93._24_4_ = auVar89._24_4_ * 0.0;
  auVar93._28_4_ = auVar89._28_4_;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar76));
  auVar88 = vpbroadcastd_avx512vl();
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar102._0_4_ = auVar13._0_4_ * auVar89._0_4_;
  auVar102._4_4_ = auVar13._4_4_ * auVar89._4_4_;
  auVar102._8_4_ = auVar13._8_4_ * auVar89._8_4_;
  auVar102._12_4_ = auVar13._12_4_ * auVar89._12_4_;
  auVar102._16_4_ = auVar89._16_4_ * 0.0;
  auVar102._20_4_ = auVar89._20_4_ * 0.0;
  auVar102._24_4_ = auVar89._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar70 * -2 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar73));
  auVar94._4_4_ = auVar14._4_4_ * auVar89._4_4_;
  auVar94._0_4_ = auVar14._0_4_ * auVar89._0_4_;
  auVar94._8_4_ = auVar14._8_4_ * auVar89._8_4_;
  auVar94._12_4_ = auVar14._12_4_ * auVar89._12_4_;
  auVar94._16_4_ = auVar89._16_4_ * 0.0;
  auVar94._20_4_ = auVar89._20_4_ * 0.0;
  auVar94._24_4_ = auVar89._24_4_ * 0.0;
  auVar94._28_4_ = auVar89._28_4_;
  auVar89 = vcvtdq2ps_avx(auVar87);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar73));
  auVar101._0_4_ = auVar14._0_4_ * auVar89._0_4_;
  auVar101._4_4_ = auVar14._4_4_ * auVar89._4_4_;
  auVar101._8_4_ = auVar14._8_4_ * auVar89._8_4_;
  auVar101._12_4_ = auVar14._12_4_ * auVar89._12_4_;
  auVar101._16_4_ = auVar89._16_4_ * 0.0;
  auVar101._20_4_ = auVar89._20_4_ * 0.0;
  auVar101._24_4_ = auVar89._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 + uVar70 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar1));
  auVar95._4_4_ = auVar89._4_4_ * auVar75._4_4_;
  auVar95._0_4_ = auVar89._0_4_ * auVar75._0_4_;
  auVar95._8_4_ = auVar89._8_4_ * auVar75._8_4_;
  auVar95._12_4_ = auVar89._12_4_ * auVar75._12_4_;
  auVar95._16_4_ = auVar89._16_4_ * 0.0;
  auVar95._20_4_ = auVar89._20_4_ * 0.0;
  auVar95._24_4_ = auVar89._24_4_ * 0.0;
  auVar95._28_4_ = auVar89._28_4_;
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x17 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,ZEXT1632(auVar1));
  auVar100._0_4_ = auVar75._0_4_ * auVar89._0_4_;
  auVar100._4_4_ = auVar75._4_4_ * auVar89._4_4_;
  auVar100._8_4_ = auVar75._8_4_ * auVar89._8_4_;
  auVar100._12_4_ = auVar75._12_4_ * auVar89._12_4_;
  auVar100._16_4_ = auVar89._16_4_ * 0.0;
  auVar100._20_4_ = auVar89._20_4_ * 0.0;
  auVar100._24_4_ = auVar89._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar89 = vpminsd_avx2(auVar93,auVar102);
  auVar87 = vpminsd_avx2(auVar94,auVar101);
  auVar89 = vmaxps_avx(auVar89,auVar87);
  auVar87 = vpminsd_avx2(auVar95,auVar100);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar90._4_4_ = uVar172;
  auVar90._0_4_ = uVar172;
  auVar90._8_4_ = uVar172;
  auVar90._12_4_ = uVar172;
  auVar90._16_4_ = uVar172;
  auVar90._20_4_ = uVar172;
  auVar90._24_4_ = uVar172;
  auVar90._28_4_ = uVar172;
  auVar87 = vmaxps_avx512vl(auVar87,auVar90);
  auVar89 = vmaxps_avx(auVar89,auVar87);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  auVar87._16_4_ = 0x3f7ffffa;
  auVar87._20_4_ = 0x3f7ffffa;
  auVar87._24_4_ = 0x3f7ffffa;
  auVar87._28_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar89,auVar87);
  auVar89 = vpmaxsd_avx2(auVar93,auVar102);
  auVar87 = vpmaxsd_avx2(auVar94,auVar101);
  auVar89 = vminps_avx(auVar89,auVar87);
  auVar87 = vpmaxsd_avx2(auVar95,auVar100);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar91._4_4_ = uVar172;
  auVar91._0_4_ = uVar172;
  auVar91._8_4_ = uVar172;
  auVar91._12_4_ = uVar172;
  auVar91._16_4_ = uVar172;
  auVar91._20_4_ = uVar172;
  auVar91._24_4_ = uVar172;
  auVar91._28_4_ = uVar172;
  auVar87 = vminps_avx512vl(auVar87,auVar91);
  auVar89 = vminps_avx(auVar89,auVar87);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar89 = vmulps_avx512vl(auVar89,auVar92);
  uVar17 = vpcmpgtd_avx512vl(auVar88,_DAT_01fe9900);
  uVar16 = vcmpps_avx512vl(local_2e0,auVar89,2);
  if ((byte)((byte)uVar16 & (byte)uVar17) == 0) {
    return false;
  }
  local_648 = (ulong)(byte)((byte)uVar16 & (byte)uVar17);
  pPVar66 = prim + lVar60 + 0x16;
  local_500 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_658 = pPVar66;
  local_650 = prim;
LAB_01cac676:
  iVar65 = 0;
  for (uVar59 = local_648; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    iVar65 = iVar65 + 1;
  }
  local_648 = local_648 - 1 & local_648;
  uVar59 = (ulong)(uint)(iVar65 << 6);
  auVar13 = *(undefined1 (*) [16])(pPVar66 + uVar59);
  if (local_648 != 0) {
    uVar63 = local_648 - 1 & local_648;
    for (uVar70 = local_648; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    }
    if (uVar63 != 0) {
      for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar14 = *(undefined1 (*) [16])(pPVar66 + uVar59 + 0x10);
  auVar75 = *(undefined1 (*) [16])(pPVar66 + uVar59 + 0x20);
  auVar76 = *(undefined1 (*) [16])(pPVar66 + uVar59 + 0x30);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar67 = *(uint *)(prim + 2);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar82._4_4_ = uVar172;
  auVar82._0_4_ = uVar172;
  auVar82._8_4_ = uVar172;
  auVar82._12_4_ = uVar172;
  fStack_570 = (float)uVar172;
  _local_580 = auVar82;
  fStack_56c = (float)uVar172;
  fStack_568 = (float)uVar172;
  register0x0000151c = uVar172;
  auVar266 = ZEXT3264(_local_580);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar83._4_4_ = uVar172;
  auVar83._0_4_ = uVar172;
  auVar83._8_4_ = uVar172;
  auVar83._12_4_ = uVar172;
  local_5a0._16_4_ = uVar172;
  local_5a0._0_16_ = auVar83;
  local_5a0._20_4_ = uVar172;
  local_5a0._24_4_ = uVar172;
  local_5a0._28_4_ = uVar172;
  auVar73 = vunpcklps_avx(auVar82,auVar83);
  fVar251 = *(float *)(ray + k * 4 + 0xc0);
  auVar258._4_4_ = fVar251;
  auVar258._0_4_ = fVar251;
  auVar258._8_4_ = fVar251;
  auVar258._12_4_ = fVar251;
  local_5c0._16_4_ = fVar251;
  local_5c0._0_16_ = auVar258;
  local_5c0._20_4_ = fVar251;
  local_5c0._24_4_ = fVar251;
  local_5c0._28_4_ = fVar251;
  local_790 = vinsertps_avx(auVar73,auVar258,0x28);
  auVar259 = ZEXT1664(local_790);
  auVar78._0_4_ = auVar13._0_4_ + auVar14._0_4_ + auVar75._0_4_ + auVar76._0_4_;
  auVar78._4_4_ = auVar13._4_4_ + auVar14._4_4_ + auVar75._4_4_ + auVar76._4_4_;
  auVar78._8_4_ = auVar13._8_4_ + auVar14._8_4_ + auVar75._8_4_ + auVar76._8_4_;
  auVar78._12_4_ = auVar13._12_4_ + auVar14._12_4_ + auVar75._12_4_ + auVar76._12_4_;
  auVar81._8_4_ = 0x3e800000;
  auVar81._0_8_ = 0x3e8000003e800000;
  auVar81._12_4_ = 0x3e800000;
  auVar73 = vmulps_avx512vl(auVar78,auVar81);
  auVar73 = vsubps_avx(auVar73,auVar1);
  auVar73 = vdpps_avx(auVar73,local_790,0x7f);
  fVar149 = *(float *)(ray + k * 4 + 0x60);
  local_7a0 = vdpps_avx(local_790,local_790,0x7f);
  auVar263 = ZEXT1664(local_7a0);
  auVar79._4_12_ = ZEXT812(0) << 0x20;
  auVar79._0_4_ = local_7a0._0_4_;
  auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar79);
  auVar77 = vfnmadd213ss_fma(auVar74,local_7a0,ZEXT416(0x40000000));
  fVar165 = auVar73._0_4_ * auVar74._0_4_ * auVar77._0_4_;
  auVar80._4_4_ = fVar165;
  auVar80._0_4_ = fVar165;
  auVar80._8_4_ = fVar165;
  auVar80._12_4_ = fVar165;
  auVar73 = vfmadd231ps_fma(auVar1,local_790,auVar80);
  auVar73 = vblendps_avx(auVar73,ZEXT816(0) << 0x40,8);
  auVar13 = vsubps_avx(auVar13,auVar73);
  auVar75 = vsubps_avx(auVar75,auVar73);
  auVar250 = ZEXT1664(auVar75);
  auVar14 = vsubps_avx(auVar14,auVar73);
  auVar254 = ZEXT1664(auVar14);
  auVar76 = vsubps_avx(auVar76,auVar73);
  auVar89 = vbroadcastss_avx512vl(auVar13);
  auVar110._8_4_ = 1;
  auVar110._0_8_ = 0x100000001;
  auVar110._12_4_ = 1;
  auVar110._16_4_ = 1;
  auVar110._20_4_ = 1;
  auVar110._24_4_ = 1;
  auVar110._28_4_ = 1;
  local_720 = ZEXT1632(auVar13);
  auVar87 = vpermps_avx512vl(auVar110,local_720);
  auVar111._8_4_ = 2;
  auVar111._0_8_ = 0x200000002;
  auVar111._12_4_ = 2;
  auVar111._16_4_ = 2;
  auVar111._20_4_ = 2;
  auVar111._24_4_ = 2;
  auVar111._28_4_ = 2;
  auVar90 = vpermps_avx512vl(auVar111,local_720);
  auVar112._8_4_ = 3;
  auVar112._0_8_ = 0x300000003;
  auVar112._12_4_ = 3;
  auVar112._16_4_ = 3;
  auVar112._20_4_ = 3;
  auVar112._24_4_ = 3;
  auVar112._28_4_ = 3;
  auVar91 = vpermps_avx512vl(auVar112,local_720);
  auVar92 = vbroadcastss_avx512vl(auVar14);
  local_760 = ZEXT1632(auVar14);
  auVar88 = vpermps_avx512vl(auVar110,local_760);
  auVar93 = vpermps_avx512vl(auVar111,local_760);
  auVar94 = vpermps_avx512vl(auVar112,local_760);
  auVar95 = vbroadcastss_avx512vl(auVar75);
  local_740 = ZEXT1632(auVar75);
  auVar96 = vpermps_avx512vl(auVar110,local_740);
  auVar86 = vpermps_avx512vl(auVar111,local_740);
  auVar97 = vpermps_avx512vl(auVar112,local_740);
  auVar98 = vbroadcastss_avx512vl(auVar76);
  _local_780 = ZEXT1632(auVar76);
  local_260 = vpermps_avx512vl(auVar110,_local_780);
  local_280 = vpermps_avx2(auVar111,_local_780);
  local_240 = vpermps_avx512vl(auVar112,_local_780);
  auVar13 = vfmadd231ps_fma(ZEXT432((uint)(fVar251 * fVar251)),local_5a0,local_5a0);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),_local_580,_local_580);
  local_220._0_4_ = auVar13._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar109);
  local_6c0 = ZEXT416((uint)fVar165);
  local_2c0 = fVar149 - fVar165;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  local_4a0 = vpbroadcastd_avx512vl();
  iVar65 = 1;
  uVar59 = 0;
  bVar68 = false;
  local_4c0 = vpbroadcastd_avx512vl();
  auVar13 = vsqrtss_avx(local_7a0,local_7a0);
  auVar14 = vsqrtss_avx(local_7a0,local_7a0);
  local_510 = ZEXT816(0x3f80000000000000);
  auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  local_2a0 = local_240;
  do {
    auVar75 = vmovshdup_avx(local_510);
    auVar75 = vsubps_avx(auVar75,local_510);
    auVar158._0_4_ = auVar75._0_4_;
    fVar15 = auVar158._0_4_ * 0.04761905;
    uVar172 = local_510._0_4_;
    auVar236._4_4_ = uVar172;
    auVar236._0_4_ = uVar172;
    auVar236._8_4_ = uVar172;
    auVar236._12_4_ = uVar172;
    auVar236._16_4_ = uVar172;
    auVar236._20_4_ = uVar172;
    auVar236._24_4_ = uVar172;
    auVar236._28_4_ = uVar172;
    auVar158._4_4_ = auVar158._0_4_;
    auVar158._8_4_ = auVar158._0_4_;
    auVar158._12_4_ = auVar158._0_4_;
    auVar158._16_4_ = auVar158._0_4_;
    auVar158._20_4_ = auVar158._0_4_;
    auVar158._24_4_ = auVar158._0_4_;
    auVar158._28_4_ = auVar158._0_4_;
    auVar75 = vfmadd231ps_fma(auVar236,auVar158,_DAT_01faff20);
    auVar84 = vsubps_avx(auVar245._0_32_,ZEXT1632(auVar75));
    fVar251 = auVar84._0_4_;
    fVar256 = auVar84._4_4_;
    fVar231 = auVar84._8_4_;
    fVar217 = auVar84._12_4_;
    fVar241 = auVar84._16_4_;
    fVar269 = auVar84._20_4_;
    fVar189 = auVar84._24_4_;
    fVar150 = fVar251 * fVar251 * fVar251;
    fVar166 = fVar256 * fVar256 * fVar256;
    auVar113._4_4_ = fVar166;
    auVar113._0_4_ = fVar150;
    fVar167 = fVar231 * fVar231 * fVar231;
    auVar113._8_4_ = fVar167;
    fVar168 = fVar217 * fVar217 * fVar217;
    auVar113._12_4_ = fVar168;
    fVar169 = fVar241 * fVar241 * fVar241;
    auVar113._16_4_ = fVar169;
    fVar170 = fVar269 * fVar269 * fVar269;
    auVar113._20_4_ = fVar170;
    fVar171 = fVar189 * fVar189 * fVar189;
    auVar113._24_4_ = fVar171;
    auVar113._28_4_ = auVar158._0_4_;
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar99 = vmulps_avx512vl(auVar113,auVar85);
    fVar255 = auVar75._0_4_;
    fVar257 = auVar75._4_4_;
    fVar232 = auVar75._8_4_;
    fVar268 = auVar75._12_4_;
    fVar188 = fVar255 * fVar255 * fVar255;
    fVar214 = fVar257 * fVar257 * fVar257;
    fVar215 = fVar232 * fVar232 * fVar232;
    fVar216 = fVar268 * fVar268 * fVar268;
    auVar55._28_4_ = DAT_01faff20._28_4_;
    auVar55._0_28_ = ZEXT1628(CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(fVar214,fVar188))));
    auVar260._0_4_ = fVar255 * fVar251;
    auVar260._4_4_ = fVar257 * fVar256;
    auVar260._8_4_ = fVar232 * fVar231;
    auVar260._12_4_ = fVar268 * fVar217;
    auVar260._16_4_ = fVar241 * 0.0;
    auVar260._20_4_ = fVar269 * 0.0;
    auVar260._28_36_ = auVar259._28_36_;
    auVar260._24_4_ = fVar189 * 0.0;
    auVar100 = vmulps_avx512vl(auVar55,auVar85);
    fVar262 = auVar100._28_4_ + auVar158._0_4_;
    auVar119._4_4_ = fVar166 * 0.16666667;
    auVar119._0_4_ = fVar150 * 0.16666667;
    auVar119._8_4_ = fVar167 * 0.16666667;
    auVar119._12_4_ = fVar168 * 0.16666667;
    auVar119._16_4_ = fVar169 * 0.16666667;
    auVar119._20_4_ = fVar170 * 0.16666667;
    auVar119._24_4_ = fVar171 * 0.16666667;
    auVar119._28_4_ = fVar262;
    auVar120._4_4_ =
         (auVar260._4_4_ * fVar256 * 12.0 + auVar260._4_4_ * fVar257 * 6.0 + fVar214 + auVar99._4_4_
         ) * 0.16666667;
    auVar120._0_4_ =
         (auVar260._0_4_ * fVar251 * 12.0 + auVar260._0_4_ * fVar255 * 6.0 + fVar188 + auVar99._0_4_
         ) * 0.16666667;
    auVar120._8_4_ =
         (auVar260._8_4_ * fVar231 * 12.0 + auVar260._8_4_ * fVar232 * 6.0 + fVar215 + auVar99._8_4_
         ) * 0.16666667;
    auVar120._12_4_ =
         (auVar260._12_4_ * fVar217 * 12.0 + auVar260._12_4_ * fVar268 * 6.0 +
         fVar216 + auVar99._12_4_) * 0.16666667;
    auVar120._16_4_ =
         (auVar260._16_4_ * fVar241 * 12.0 + auVar260._16_4_ * 0.0 * 6.0 + auVar99._16_4_ + 0.0) *
         0.16666667;
    auVar120._20_4_ =
         (auVar260._20_4_ * fVar269 * 12.0 + auVar260._20_4_ * 0.0 * 6.0 + auVar99._20_4_ + 0.0) *
         0.16666667;
    auVar120._24_4_ =
         (auVar260._24_4_ * fVar189 * 12.0 + auVar260._24_4_ * 0.0 * 6.0 + auVar99._24_4_ + 0.0) *
         0.16666667;
    auVar120._28_4_ = auVar263._28_4_;
    auVar121._4_4_ =
         (auVar100._4_4_ + fVar166 +
         auVar260._4_4_ * fVar257 * 12.0 + auVar260._4_4_ * fVar256 * 6.0) * 0.16666667;
    auVar121._0_4_ =
         (auVar100._0_4_ + fVar150 +
         auVar260._0_4_ * fVar255 * 12.0 + auVar260._0_4_ * fVar251 * 6.0) * 0.16666667;
    auVar121._8_4_ =
         (auVar100._8_4_ + fVar167 +
         auVar260._8_4_ * fVar232 * 12.0 + auVar260._8_4_ * fVar231 * 6.0) * 0.16666667;
    auVar121._12_4_ =
         (auVar100._12_4_ + fVar168 +
         auVar260._12_4_ * fVar268 * 12.0 + auVar260._12_4_ * fVar217 * 6.0) * 0.16666667;
    auVar121._16_4_ =
         (auVar100._16_4_ + fVar169 + auVar260._16_4_ * 0.0 * 12.0 + auVar260._16_4_ * fVar241 * 6.0
         ) * 0.16666667;
    auVar121._20_4_ =
         (auVar100._20_4_ + fVar170 + auVar260._20_4_ * 0.0 * 12.0 + auVar260._20_4_ * fVar269 * 6.0
         ) * 0.16666667;
    auVar121._24_4_ =
         (auVar100._24_4_ + fVar171 + auVar260._24_4_ * 0.0 * 12.0 + auVar260._24_4_ * fVar189 * 6.0
         ) * 0.16666667;
    auVar121._28_4_ = auVar266._28_4_;
    auVar122._28_4_ = fVar262 + auVar263._28_4_ + auVar245._28_4_;
    auVar122._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * 0.16666667,
                            CONCAT48(fVar215 * 0.16666667,
                                     CONCAT44(fVar214 * 0.16666667,fVar188 * 0.16666667))));
    auVar99 = vmulps_avx512vl(auVar98,auVar122);
    auVar100 = vmulps_avx512vl(local_260,auVar122);
    auVar123._4_4_ = local_280._4_4_ * fVar214 * 0.16666667;
    auVar123._0_4_ = local_280._0_4_ * fVar188 * 0.16666667;
    auVar123._8_4_ = local_280._8_4_ * fVar215 * 0.16666667;
    auVar123._12_4_ = local_280._12_4_ * fVar216 * 0.16666667;
    auVar123._16_4_ = local_280._16_4_ * 0.0;
    auVar123._20_4_ = local_280._20_4_ * 0.0;
    auVar123._24_4_ = local_280._24_4_ * 0.0;
    auVar123._28_4_ = auVar158._0_4_;
    auVar101 = vmulps_avx512vl(local_2a0,auVar122);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar121,auVar95);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar121,auVar96);
    auVar102 = vfmadd231ps_avx512vl(auVar123,auVar121,auVar86);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar121);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar120,auVar92);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar120,auVar88);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar120,auVar93);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar94,auVar120);
    auVar103 = vfmadd231ps_avx512vl(auVar99,auVar119,auVar89);
    auVar104 = vfmadd231ps_avx512vl(auVar100,auVar119,auVar87);
    auVar105 = vfmadd231ps_avx512vl(auVar102,auVar119,auVar90);
    auVar99 = vfmadd231ps_avx512vl(auVar101,auVar91,auVar119);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar100 = vxorps_avx512vl(auVar84,auVar106);
    auVar101 = vxorps_avx512vl(ZEXT1632(auVar75),auVar106);
    auVar237._0_4_ = auVar101._0_4_ * fVar255;
    auVar237._4_4_ = auVar101._4_4_ * fVar257;
    auVar237._8_4_ = auVar101._8_4_ * fVar232;
    auVar237._12_4_ = auVar101._12_4_ * fVar268;
    auVar237._16_4_ = auVar101._16_4_ * 0.0;
    auVar237._20_4_ = auVar101._20_4_ * 0.0;
    auVar237._24_4_ = auVar101._24_4_ * 0.0;
    auVar237._28_4_ = 0;
    auVar101 = vmulps_avx512vl(auVar260._0_32_,auVar85);
    auVar85 = vsubps_avx(auVar237,auVar101);
    auVar124._4_4_ = auVar100._4_4_ * fVar256 * 0.5;
    auVar124._0_4_ = auVar100._0_4_ * fVar251 * 0.5;
    auVar124._8_4_ = auVar100._8_4_ * fVar231 * 0.5;
    auVar124._12_4_ = auVar100._12_4_ * fVar217 * 0.5;
    auVar124._16_4_ = auVar100._16_4_ * fVar241 * 0.5;
    auVar124._20_4_ = auVar100._20_4_ * fVar269 * 0.5;
    auVar124._24_4_ = auVar100._24_4_ * fVar189 * 0.5;
    auVar124._28_4_ = auVar84._28_4_;
    auVar125._4_4_ = auVar85._4_4_ * 0.5;
    auVar125._0_4_ = auVar85._0_4_ * 0.5;
    auVar125._8_4_ = auVar85._8_4_ * 0.5;
    auVar125._12_4_ = auVar85._12_4_ * 0.5;
    auVar125._16_4_ = auVar85._16_4_ * 0.5;
    auVar125._20_4_ = auVar85._20_4_ * 0.5;
    auVar125._24_4_ = auVar85._24_4_ * 0.5;
    auVar125._28_4_ = auVar85._28_4_;
    auVar128._4_4_ = (auVar101._4_4_ + fVar256 * fVar256) * 0.5;
    auVar128._0_4_ = (auVar101._0_4_ + fVar251 * fVar251) * 0.5;
    auVar128._8_4_ = (auVar101._8_4_ + fVar231 * fVar231) * 0.5;
    auVar128._12_4_ = (auVar101._12_4_ + fVar217 * fVar217) * 0.5;
    auVar128._16_4_ = (auVar101._16_4_ + fVar241 * fVar241) * 0.5;
    auVar128._20_4_ = (auVar101._20_4_ + fVar269 * fVar269) * 0.5;
    auVar128._24_4_ = (auVar101._24_4_ + fVar189 * fVar189) * 0.5;
    auVar128._28_4_ = auVar101._28_4_ + auVar250._28_4_;
    fVar251 = fVar255 * fVar255 * 0.5;
    fVar255 = fVar257 * fVar257 * 0.5;
    fVar256 = fVar232 * fVar232 * 0.5;
    fVar257 = fVar268 * fVar268 * 0.5;
    auVar129._28_4_ = auVar254._28_4_;
    auVar129._0_28_ = ZEXT1628(CONCAT412(fVar257,CONCAT48(fVar256,CONCAT44(fVar255,fVar251))));
    auVar228._4_4_ = auVar98._4_4_ * fVar255;
    auVar228._0_4_ = auVar98._0_4_ * fVar251;
    auVar228._8_4_ = auVar98._8_4_ * fVar256;
    auVar228._12_4_ = auVar98._12_4_ * fVar257;
    auVar228._16_4_ = auVar98._16_4_ * 0.0;
    auVar228._20_4_ = auVar98._20_4_ * 0.0;
    auVar228._24_4_ = auVar98._24_4_ * 0.0;
    auVar228._28_4_ = 0x3f000000;
    auVar84 = vmulps_avx512vl(local_260,auVar129);
    auVar32._4_4_ = local_280._4_4_ * fVar255;
    auVar32._0_4_ = local_280._0_4_ * fVar251;
    auVar32._8_4_ = local_280._8_4_ * fVar256;
    auVar32._12_4_ = local_280._12_4_ * fVar257;
    auVar32._16_4_ = local_280._16_4_ * 0.0;
    auVar32._20_4_ = local_280._20_4_ * 0.0;
    auVar32._24_4_ = local_280._24_4_ * 0.0;
    auVar32._28_4_ = auVar98._28_4_;
    auVar85 = vmulps_avx512vl(local_2a0,auVar129);
    auVar100 = vfmadd231ps_avx512vl(auVar228,auVar128,auVar95);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar128,auVar96);
    auVar101 = vfmadd231ps_avx512vl(auVar32,auVar128,auVar86);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar97,auVar128);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar125,auVar92);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar125,auVar88);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar125,auVar93);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar94,auVar125);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar124,auVar89);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar124,auVar87);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar124,auVar90);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar91,auVar124);
    auVar33._4_4_ = auVar100._4_4_ * fVar15;
    auVar33._0_4_ = auVar100._0_4_ * fVar15;
    auVar33._8_4_ = auVar100._8_4_ * fVar15;
    auVar33._12_4_ = auVar100._12_4_ * fVar15;
    auVar33._16_4_ = auVar100._16_4_ * fVar15;
    auVar33._20_4_ = auVar100._20_4_ * fVar15;
    auVar33._24_4_ = auVar100._24_4_ * fVar15;
    auVar33._28_4_ = auVar266._28_4_;
    auVar266 = ZEXT3264(auVar33);
    auVar34._4_4_ = auVar84._4_4_ * fVar15;
    auVar34._0_4_ = auVar84._0_4_ * fVar15;
    auVar34._8_4_ = auVar84._8_4_ * fVar15;
    auVar34._12_4_ = auVar84._12_4_ * fVar15;
    auVar34._16_4_ = auVar84._16_4_ * fVar15;
    auVar34._20_4_ = auVar84._20_4_ * fVar15;
    auVar34._24_4_ = auVar84._24_4_ * fVar15;
    auVar34._28_4_ = 0x3e2aaaab;
    auVar35._4_4_ = auVar101._4_4_ * fVar15;
    auVar35._0_4_ = auVar101._0_4_ * fVar15;
    auVar35._8_4_ = auVar101._8_4_ * fVar15;
    auVar35._12_4_ = auVar101._12_4_ * fVar15;
    auVar35._16_4_ = auVar101._16_4_ * fVar15;
    auVar35._20_4_ = auVar101._20_4_ * fVar15;
    auVar35._24_4_ = auVar101._24_4_ * fVar15;
    auVar35._28_4_ = 0x40c00000;
    fVar251 = auVar85._0_4_ * fVar15;
    fVar255 = auVar85._4_4_ * fVar15;
    auVar36._4_4_ = fVar255;
    auVar36._0_4_ = fVar251;
    fVar256 = auVar85._8_4_ * fVar15;
    auVar36._8_4_ = fVar256;
    fVar257 = auVar85._12_4_ * fVar15;
    auVar36._12_4_ = fVar257;
    fVar231 = auVar85._16_4_ * fVar15;
    auVar36._16_4_ = fVar231;
    fVar232 = auVar85._20_4_ * fVar15;
    auVar36._20_4_ = fVar232;
    fVar217 = auVar85._24_4_ * fVar15;
    auVar36._24_4_ = fVar217;
    auVar36._28_4_ = fVar15;
    auVar75 = vxorps_avx512vl(auVar97._0_16_,auVar97._0_16_);
    auVar107 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,ZEXT1632(auVar75));
    auVar259 = ZEXT3264(auVar107);
    auVar108 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,ZEXT1632(auVar75));
    auVar100 = ZEXT1632(auVar75);
    auVar109 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,auVar100);
    auVar263 = ZEXT3264(auVar109);
    auVar238._0_4_ = fVar251 + auVar99._0_4_;
    auVar238._4_4_ = fVar255 + auVar99._4_4_;
    auVar238._8_4_ = fVar256 + auVar99._8_4_;
    auVar238._12_4_ = fVar257 + auVar99._12_4_;
    auVar238._16_4_ = fVar231 + auVar99._16_4_;
    auVar238._20_4_ = fVar232 + auVar99._20_4_;
    auVar238._24_4_ = fVar217 + auVar99._24_4_;
    auVar238._28_4_ = fVar15 + auVar99._28_4_;
    auVar84 = vmaxps_avx(auVar99,auVar238);
    auVar85 = vminps_avx(auVar99,auVar238);
    auVar110 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,auVar100);
    auVar111 = vpermt2ps_avx512vl(auVar33,_DAT_01feed00,auVar100);
    auVar254 = ZEXT3264(auVar111);
    auVar112 = vpermt2ps_avx512vl(auVar34,_DAT_01feed00,auVar100);
    auVar124 = ZEXT1632(auVar75);
    auVar113 = vpermt2ps_avx512vl(auVar35,_DAT_01feed00,auVar124);
    auVar99 = vpermt2ps_avx512vl(auVar36,_DAT_01feed00,auVar124);
    auVar114 = vsubps_avx512vl(auVar110,auVar99);
    auVar99 = vsubps_avx(auVar107,auVar103);
    auVar250 = ZEXT3264(auVar99);
    auVar100 = vsubps_avx(auVar108,auVar104);
    auVar101 = vsubps_avx(auVar109,auVar105);
    auVar102 = vmulps_avx512vl(auVar100,auVar35);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar34,auVar101);
    auVar115 = vmulps_avx512vl(auVar101,auVar33);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar35,auVar99);
    auVar116 = vmulps_avx512vl(auVar99,auVar34);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar33,auVar100);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar102,auVar102);
    auVar102 = vmulps_avx512vl(auVar101,auVar101);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar100);
    auVar117 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar99);
    auVar116 = vrcp14ps_avx512vl(auVar117);
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar118 = vfnmadd213ps_avx512vl(auVar116,auVar117,auVar102);
    auVar116 = vfmadd132ps_avx512vl(auVar118,auVar116,auVar116);
    auVar115 = vmulps_avx512vl(auVar115,auVar116);
    auVar118 = vmulps_avx512vl(auVar100,auVar113);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar112,auVar101);
    auVar119 = vmulps_avx512vl(auVar101,auVar111);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar113,auVar99);
    auVar120 = vmulps_avx512vl(auVar99,auVar112);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar111,auVar100);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar116 = vmulps_avx512vl(auVar118,auVar116);
    auVar115 = vmaxps_avx512vl(auVar115,auVar116);
    auVar115 = vsqrtps_avx512vl(auVar115);
    auVar116 = vmaxps_avx512vl(auVar114,auVar110);
    auVar84 = vmaxps_avx512vl(auVar84,auVar116);
    auVar118 = vaddps_avx512vl(auVar115,auVar84);
    auVar84 = vminps_avx512vl(auVar114,auVar110);
    auVar84 = vminps_avx(auVar85,auVar84);
    auVar84 = vsubps_avx512vl(auVar84,auVar115);
    auVar114._8_4_ = 0x3f800002;
    auVar114._0_8_ = 0x3f8000023f800002;
    auVar114._12_4_ = 0x3f800002;
    auVar114._16_4_ = 0x3f800002;
    auVar114._20_4_ = 0x3f800002;
    auVar114._24_4_ = 0x3f800002;
    auVar114._28_4_ = 0x3f800002;
    auVar85 = vmulps_avx512vl(auVar118,auVar114);
    auVar115._8_4_ = 0x3f7ffffc;
    auVar115._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar115._12_4_ = 0x3f7ffffc;
    auVar115._16_4_ = 0x3f7ffffc;
    auVar115._20_4_ = 0x3f7ffffc;
    auVar115._24_4_ = 0x3f7ffffc;
    auVar115._28_4_ = 0x3f7ffffc;
    auVar84 = vmulps_avx512vl(auVar84,auVar115);
    auVar85 = vmulps_avx512vl(auVar85,auVar85);
    auVar110 = vrsqrt14ps_avx512vl(auVar117);
    auVar116._8_4_ = 0xbf000000;
    auVar116._0_8_ = 0xbf000000bf000000;
    auVar116._12_4_ = 0xbf000000;
    auVar116._16_4_ = 0xbf000000;
    auVar116._20_4_ = 0xbf000000;
    auVar116._24_4_ = 0xbf000000;
    auVar116._28_4_ = 0xbf000000;
    auVar114 = vmulps_avx512vl(auVar117,auVar116);
    fVar251 = auVar110._0_4_;
    fVar255 = auVar110._4_4_;
    fVar256 = auVar110._8_4_;
    fVar257 = auVar110._12_4_;
    fVar231 = auVar110._16_4_;
    fVar232 = auVar110._20_4_;
    fVar217 = auVar110._24_4_;
    auVar37._4_4_ = fVar255 * fVar255 * fVar255 * auVar114._4_4_;
    auVar37._0_4_ = fVar251 * fVar251 * fVar251 * auVar114._0_4_;
    auVar37._8_4_ = fVar256 * fVar256 * fVar256 * auVar114._8_4_;
    auVar37._12_4_ = fVar257 * fVar257 * fVar257 * auVar114._12_4_;
    auVar37._16_4_ = fVar231 * fVar231 * fVar231 * auVar114._16_4_;
    auVar37._20_4_ = fVar232 * fVar232 * fVar232 * auVar114._20_4_;
    auVar37._24_4_ = fVar217 * fVar217 * fVar217 * auVar114._24_4_;
    auVar37._28_4_ = auVar118._28_4_;
    auVar117._8_4_ = 0x3fc00000;
    auVar117._0_8_ = 0x3fc000003fc00000;
    auVar117._12_4_ = 0x3fc00000;
    auVar117._16_4_ = 0x3fc00000;
    auVar117._20_4_ = 0x3fc00000;
    auVar117._24_4_ = 0x3fc00000;
    auVar117._28_4_ = 0x3fc00000;
    auVar110 = vfmadd231ps_avx512vl(auVar37,auVar110,auVar117);
    auVar114 = vmulps_avx512vl(auVar99,auVar110);
    auVar115 = vmulps_avx512vl(auVar100,auVar110);
    auVar116 = vmulps_avx512vl(auVar101,auVar110);
    auVar117 = vsubps_avx512vl(auVar124,auVar103);
    auVar119 = vsubps_avx512vl(auVar124,auVar104);
    auVar120 = vsubps_avx512vl(auVar124,auVar105);
    auVar118 = vmulps_avx512vl(local_5c0,auVar120);
    auVar118 = vfmadd231ps_avx512vl(auVar118,local_5a0,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar118,_local_580,auVar117);
    auVar121 = vmulps_avx512vl(auVar120,auVar120);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar119,auVar119);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,auVar117);
    auVar122 = vmulps_avx512vl(local_5c0,auVar116);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar115,local_5a0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar114,_local_580);
    auVar116 = vmulps_avx512vl(auVar120,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar119,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar114);
    auVar115 = vmulps_avx512vl(auVar122,auVar122);
    auVar116 = vsubps_avx512vl(local_220,auVar115);
    auVar123 = vmulps_avx512vl(auVar122,auVar114);
    auVar118 = vsubps_avx512vl(auVar118,auVar123);
    auVar123 = vaddps_avx512vl(auVar118,auVar118);
    auVar118 = vmulps_avx512vl(auVar114,auVar114);
    local_7c0 = vsubps_avx512vl(auVar121,auVar118);
    auVar85 = vsubps_avx512vl(local_7c0,auVar85);
    local_700 = vmulps_avx512vl(auVar123,auVar123);
    auVar118._8_4_ = 0x40800000;
    auVar118._0_8_ = 0x4080000040800000;
    auVar118._12_4_ = 0x40800000;
    auVar118._16_4_ = 0x40800000;
    auVar118._20_4_ = 0x40800000;
    auVar118._24_4_ = 0x40800000;
    auVar118._28_4_ = 0x40800000;
    auVar118 = vmulps_avx512vl(auVar116,auVar118);
    auVar121 = vmulps_avx512vl(auVar118,auVar85);
    auVar121 = vsubps_avx512vl(local_700,auVar121);
    uVar70 = vcmpps_avx512vl(auVar121,auVar124,5);
    bVar56 = (byte)uVar70;
    if (bVar56 == 0) {
LAB_01cad3c6:
      auVar245 = ZEXT3264(auVar102);
    }
    else {
      auVar121 = vsqrtps_avx512vl(auVar121);
      auVar124 = vaddps_avx512vl(auVar116,auVar116);
      auVar125 = vrcp14ps_avx512vl(auVar124);
      auVar102 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar102);
      auVar102 = vfmadd132ps_avx512vl(auVar102,auVar125,auVar125);
      _local_600 = vxorps_avx512vl(auVar123,auVar106);
      auVar106 = vsubps_avx512vl(_local_600,auVar121);
      auVar106 = vmulps_avx512vl(auVar106,auVar102);
      auVar121 = vsubps_avx512vl(auVar121,auVar123);
      local_5e0 = vmulps_avx512vl(auVar121,auVar102);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar121 = vblendmps_avx512vl(auVar102,auVar106);
      auVar126._0_4_ =
           (uint)(bVar56 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar102._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar69 * auVar121._4_4_ | (uint)!bVar69 * auVar102._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar69 * auVar121._8_4_ | (uint)!bVar69 * auVar102._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar69 * auVar121._12_4_ | (uint)!bVar69 * auVar102._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar69 * auVar121._16_4_ | (uint)!bVar69 * auVar102._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar69 * auVar121._20_4_ | (uint)!bVar69 * auVar102._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar69 * auVar121._24_4_ | (uint)!bVar69 * auVar102._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar126._28_4_ = (uint)bVar69 * auVar121._28_4_ | (uint)!bVar69 * auVar102._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar102,local_5e0);
      auVar127._0_4_ =
           (uint)(bVar56 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar102._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar69 * auVar121._4_4_ | (uint)!bVar69 * auVar102._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar69 * auVar121._8_4_ | (uint)!bVar69 * auVar102._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar69 * auVar121._12_4_ | (uint)!bVar69 * auVar102._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar69 * auVar121._16_4_ | (uint)!bVar69 * auVar102._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar69 * auVar121._20_4_ | (uint)!bVar69 * auVar102._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar69 * auVar121._24_4_ | (uint)!bVar69 * auVar102._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar127._28_4_ = (uint)bVar69 * auVar121._28_4_ | (uint)!bVar69 * auVar102._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar115,auVar102);
      local_620 = vmaxps_avx512vl(local_240,auVar102);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      local_640 = vmulps_avx512vl(local_620,auVar26);
      vandps_avx512vl(auVar116,auVar102);
      uVar63 = vcmpps_avx512vl(local_640,local_640,1);
      uVar70 = uVar70 & uVar63;
      bVar61 = (byte)uVar70;
      if (bVar61 != 0) {
        uVar63 = vcmpps_avx512vl(auVar85,_DAT_01faff00,2);
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar115 = vblendmps_avx512vl(auVar85,auVar102);
        bVar62 = (byte)uVar63;
        uVar72 = (uint)(bVar62 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar62 & 1) * local_640._0_4_;
        bVar69 = (bool)((byte)(uVar63 >> 1) & 1);
        uVar71 = (uint)bVar69 * auVar115._4_4_ | (uint)!bVar69 * local_640._4_4_;
        bVar69 = (bool)((byte)(uVar63 >> 2) & 1);
        uVar142 = (uint)bVar69 * auVar115._8_4_ | (uint)!bVar69 * local_640._8_4_;
        bVar69 = (bool)((byte)(uVar63 >> 3) & 1);
        uVar143 = (uint)bVar69 * auVar115._12_4_ | (uint)!bVar69 * local_640._12_4_;
        bVar69 = (bool)((byte)(uVar63 >> 4) & 1);
        uVar144 = (uint)bVar69 * auVar115._16_4_ | (uint)!bVar69 * local_640._16_4_;
        bVar69 = (bool)((byte)(uVar63 >> 5) & 1);
        uVar145 = (uint)bVar69 * auVar115._20_4_ | (uint)!bVar69 * local_640._20_4_;
        bVar69 = (bool)((byte)(uVar63 >> 6) & 1);
        uVar146 = (uint)bVar69 * auVar115._24_4_ | (uint)!bVar69 * local_640._24_4_;
        bVar69 = SUB81(uVar63 >> 7,0);
        uVar147 = (uint)bVar69 * auVar115._28_4_ | (uint)!bVar69 * local_640._28_4_;
        auVar126._0_4_ = (bVar61 & 1) * uVar72 | !(bool)(bVar61 & 1) * auVar126._0_4_;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar126._4_4_ = bVar69 * uVar71 | !bVar69 * auVar126._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar126._8_4_ = bVar69 * uVar142 | !bVar69 * auVar126._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar126._12_4_ = bVar69 * uVar143 | !bVar69 * auVar126._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar126._16_4_ = bVar69 * uVar144 | !bVar69 * auVar126._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar126._20_4_ = bVar69 * uVar145 | !bVar69 * auVar126._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar126._24_4_ = bVar69 * uVar146 | !bVar69 * auVar126._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar126._28_4_ = bVar69 * uVar147 | !bVar69 * auVar126._28_4_;
        auVar85 = vblendmps_avx512vl(auVar102,auVar85);
        bVar69 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
        bVar11 = SUB81(uVar63 >> 7,0);
        auVar127._0_4_ =
             (uint)(bVar61 & 1) *
             ((uint)(bVar62 & 1) * auVar85._0_4_ | !(bool)(bVar62 & 1) * uVar72) |
             !(bool)(bVar61 & 1) * auVar127._0_4_;
        bVar5 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar127._4_4_ =
             (uint)bVar5 * ((uint)bVar69 * auVar85._4_4_ | !bVar69 * uVar71) |
             !bVar5 * auVar127._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar127._8_4_ =
             (uint)bVar69 * ((uint)bVar6 * auVar85._8_4_ | !bVar6 * uVar142) |
             !bVar69 * auVar127._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar127._12_4_ =
             (uint)bVar69 * ((uint)bVar7 * auVar85._12_4_ | !bVar7 * uVar143) |
             !bVar69 * auVar127._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar127._16_4_ =
             (uint)bVar69 * ((uint)bVar8 * auVar85._16_4_ | !bVar8 * uVar144) |
             !bVar69 * auVar127._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar127._20_4_ =
             (uint)bVar69 * ((uint)bVar9 * auVar85._20_4_ | !bVar9 * uVar145) |
             !bVar69 * auVar127._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar127._24_4_ =
             (uint)bVar69 * ((uint)bVar10 * auVar85._24_4_ | !bVar10 * uVar146) |
             !bVar69 * auVar127._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar127._28_4_ =
             (uint)bVar69 * ((uint)bVar11 * auVar85._28_4_ | !bVar11 * uVar147) |
             !bVar69 * auVar127._28_4_;
        bVar56 = (~bVar61 | bVar62) & bVar56;
      }
      if ((bVar56 & 0x7f) == 0) {
        auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
      }
      else {
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar115 = vxorps_avx512vl(auVar113,auVar85);
        auVar111 = vxorps_avx512vl(auVar111,auVar85);
        uVar72 = *(uint *)(ray + k * 4 + 0x100);
        auVar112 = vxorps_avx512vl(auVar112,auVar85);
        auVar75 = vsubss_avx512f(ZEXT416(uVar72),ZEXT416((uint)local_6c0._0_4_));
        auVar102 = vbroadcastss_avx512vl(auVar75);
        auVar116 = vminps_avx512vl(auVar102,auVar127);
        auVar54._4_4_ = fStack_2bc;
        auVar54._0_4_ = local_2c0;
        auVar54._8_4_ = fStack_2b8;
        auVar54._12_4_ = fStack_2b4;
        auVar54._16_4_ = fStack_2b0;
        auVar54._20_4_ = fStack_2ac;
        auVar54._24_4_ = fStack_2a8;
        auVar54._28_4_ = fStack_2a4;
        auVar113 = vmaxps_avx512vl(auVar54,auVar126);
        auVar102 = vmulps_avx512vl(auVar35,auVar120);
        auVar102 = vfmadd213ps_avx512vl(auVar119,auVar34,auVar102);
        auVar75 = vfmadd213ps_fma(auVar117,auVar33,auVar102);
        auVar102 = vmulps_avx512vl(local_5c0,auVar35);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_5a0,auVar34);
        auVar76 = vfmadd231ps_fma(auVar102,_local_580,auVar33);
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar76),auVar117);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar16 = vcmpps_avx512vl(auVar117,auVar119,1);
        auVar120 = vxorps_avx512vl(ZEXT1632(auVar75),auVar85);
        auVar121 = vrcp14ps_avx512vl(ZEXT1632(auVar76));
        auVar228 = ZEXT1632(auVar76);
        auVar128 = vxorps_avx512vl(auVar228,auVar85);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar129 = vfnmadd213ps_avx512vl(auVar121,auVar228,auVar102);
        auVar75 = vfmadd132ps_fma(auVar129,auVar121,auVar121);
        fVar251 = auVar75._0_4_ * auVar120._0_4_;
        fVar255 = auVar75._4_4_ * auVar120._4_4_;
        auVar38._4_4_ = fVar255;
        auVar38._0_4_ = fVar251;
        fVar256 = auVar75._8_4_ * auVar120._8_4_;
        auVar38._8_4_ = fVar256;
        fVar257 = auVar75._12_4_ * auVar120._12_4_;
        auVar38._12_4_ = fVar257;
        fVar231 = auVar120._16_4_ * 0.0;
        auVar38._16_4_ = fVar231;
        fVar232 = auVar120._20_4_ * 0.0;
        auVar38._20_4_ = fVar232;
        fVar217 = auVar120._24_4_ * 0.0;
        auVar38._24_4_ = fVar217;
        auVar38._28_4_ = auVar120._28_4_;
        uVar17 = vcmpps_avx512vl(auVar228,auVar128,1);
        bVar61 = (byte)uVar16 | (byte)uVar17;
        auVar267._8_4_ = 0xff800000;
        auVar267._0_8_ = 0xff800000ff800000;
        auVar267._12_4_ = 0xff800000;
        auVar267._16_4_ = 0xff800000;
        auVar267._20_4_ = 0xff800000;
        auVar267._24_4_ = 0xff800000;
        auVar267._28_4_ = 0xff800000;
        auVar129 = vblendmps_avx512vl(auVar38,auVar267);
        auVar130._0_4_ =
             (uint)(bVar61 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar121._0_4_;
        bVar69 = (bool)(bVar61 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar69 * auVar129._4_4_ | (uint)!bVar69 * auVar121._4_4_;
        bVar69 = (bool)(bVar61 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar69 * auVar129._8_4_ | (uint)!bVar69 * auVar121._8_4_;
        bVar69 = (bool)(bVar61 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar69 * auVar129._12_4_ | (uint)!bVar69 * auVar121._12_4_;
        bVar69 = (bool)(bVar61 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar69 * auVar129._16_4_ | (uint)!bVar69 * auVar121._16_4_;
        bVar69 = (bool)(bVar61 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar69 * auVar129._20_4_ | (uint)!bVar69 * auVar121._20_4_;
        bVar69 = (bool)(bVar61 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar69 * auVar129._24_4_ | (uint)!bVar69 * auVar121._24_4_;
        auVar130._28_4_ =
             (uint)(bVar61 >> 7) * auVar129._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar121._28_4_;
        auVar113 = vmaxps_avx512vl(auVar113,auVar130);
        auVar266 = ZEXT3264(auVar113);
        uVar17 = vcmpps_avx512vl(auVar228,auVar128,6);
        bVar61 = (byte)uVar16 | (byte)uVar17;
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar131._0_4_ =
             (uint)(bVar61 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)fVar251;
        bVar69 = (bool)(bVar61 >> 1 & 1);
        auVar131._4_4_ = (uint)bVar69 * auVar121._4_4_ | (uint)!bVar69 * (int)fVar255;
        bVar69 = (bool)(bVar61 >> 2 & 1);
        auVar131._8_4_ = (uint)bVar69 * auVar121._8_4_ | (uint)!bVar69 * (int)fVar256;
        bVar69 = (bool)(bVar61 >> 3 & 1);
        auVar131._12_4_ = (uint)bVar69 * auVar121._12_4_ | (uint)!bVar69 * (int)fVar257;
        bVar69 = (bool)(bVar61 >> 4 & 1);
        auVar131._16_4_ = (uint)bVar69 * auVar121._16_4_ | (uint)!bVar69 * (int)fVar231;
        bVar69 = (bool)(bVar61 >> 5 & 1);
        auVar131._20_4_ = (uint)bVar69 * auVar121._20_4_ | (uint)!bVar69 * (int)fVar232;
        bVar69 = (bool)(bVar61 >> 6 & 1);
        auVar131._24_4_ = (uint)bVar69 * auVar121._24_4_ | (uint)!bVar69 * (int)fVar217;
        auVar131._28_4_ =
             (uint)(bVar61 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar120._28_4_;
        auVar120 = vminps_avx512vl(auVar116,auVar131);
        auVar75 = vxorps_avx512vl(auVar116._0_16_,auVar116._0_16_);
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar75),auVar107);
        auVar108 = vsubps_avx512vl(ZEXT1632(auVar75),auVar108);
        auVar116 = ZEXT1632(auVar75);
        auVar109 = vsubps_avx512vl(auVar116,auVar109);
        auVar109 = vmulps_avx512vl(auVar109,auVar115);
        auVar108 = vfmadd231ps_avx512vl(auVar109,auVar112,auVar108);
        auVar107 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar107);
        auVar108 = vmulps_avx512vl(local_5c0,auVar115);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_5a0,auVar112);
        auVar108 = vfmadd231ps_avx512vl(auVar108,_local_580,auVar111);
        vandps_avx512vl(auVar108,auVar117);
        uVar16 = vcmpps_avx512vl(auVar108,auVar119,1);
        auVar107 = vxorps_avx512vl(auVar107,auVar85);
        auVar109 = vrcp14ps_avx512vl(auVar108);
        auVar85 = vxorps_avx512vl(auVar108,auVar85);
        auVar263 = ZEXT3264(auVar85);
        auVar111 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar102);
        auVar75 = vfmadd132ps_fma(auVar111,auVar109,auVar109);
        fVar251 = auVar75._0_4_ * auVar107._0_4_;
        fVar255 = auVar75._4_4_ * auVar107._4_4_;
        auVar39._4_4_ = fVar255;
        auVar39._0_4_ = fVar251;
        fVar256 = auVar75._8_4_ * auVar107._8_4_;
        auVar39._8_4_ = fVar256;
        fVar257 = auVar75._12_4_ * auVar107._12_4_;
        auVar39._12_4_ = fVar257;
        fVar231 = auVar107._16_4_ * 0.0;
        auVar39._16_4_ = fVar231;
        fVar232 = auVar107._20_4_ * 0.0;
        auVar39._20_4_ = fVar232;
        fVar217 = auVar107._24_4_ * 0.0;
        auVar39._24_4_ = fVar217;
        auVar39._28_4_ = auVar107._28_4_;
        uVar17 = vcmpps_avx512vl(auVar108,auVar85,1);
        bVar61 = (byte)uVar16 | (byte)uVar17;
        auVar111 = vblendmps_avx512vl(auVar39,auVar267);
        auVar132._0_4_ =
             (uint)(bVar61 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar109._0_4_;
        bVar69 = (bool)(bVar61 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar69 * auVar111._4_4_ | (uint)!bVar69 * auVar109._4_4_;
        bVar69 = (bool)(bVar61 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar69 * auVar111._8_4_ | (uint)!bVar69 * auVar109._8_4_;
        bVar69 = (bool)(bVar61 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar69 * auVar111._12_4_ | (uint)!bVar69 * auVar109._12_4_;
        bVar69 = (bool)(bVar61 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar69 * auVar111._16_4_ | (uint)!bVar69 * auVar109._16_4_;
        bVar69 = (bool)(bVar61 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar69 * auVar111._20_4_ | (uint)!bVar69 * auVar109._20_4_;
        bVar69 = (bool)(bVar61 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar69 * auVar111._24_4_ | (uint)!bVar69 * auVar109._24_4_;
        auVar132._28_4_ =
             (uint)(bVar61 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar109._28_4_;
        _local_7e0 = vmaxps_avx(auVar113,auVar132);
        auVar254 = ZEXT3264(_local_7e0);
        uVar17 = vcmpps_avx512vl(auVar108,auVar85,6);
        bVar61 = (byte)uVar16 | (byte)uVar17;
        auVar133._0_4_ =
             (uint)(bVar61 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)fVar251;
        bVar69 = (bool)(bVar61 >> 1 & 1);
        auVar133._4_4_ = (uint)bVar69 * auVar121._4_4_ | (uint)!bVar69 * (int)fVar255;
        bVar69 = (bool)(bVar61 >> 2 & 1);
        auVar133._8_4_ = (uint)bVar69 * auVar121._8_4_ | (uint)!bVar69 * (int)fVar256;
        bVar69 = (bool)(bVar61 >> 3 & 1);
        auVar133._12_4_ = (uint)bVar69 * auVar121._12_4_ | (uint)!bVar69 * (int)fVar257;
        bVar69 = (bool)(bVar61 >> 4 & 1);
        auVar133._16_4_ = (uint)bVar69 * auVar121._16_4_ | (uint)!bVar69 * (int)fVar231;
        bVar69 = (bool)(bVar61 >> 5 & 1);
        auVar133._20_4_ = (uint)bVar69 * auVar121._20_4_ | (uint)!bVar69 * (int)fVar232;
        bVar69 = (bool)(bVar61 >> 6 & 1);
        auVar133._24_4_ = (uint)bVar69 * auVar121._24_4_ | (uint)!bVar69 * (int)fVar217;
        auVar133._28_4_ =
             (uint)(bVar61 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar107._28_4_;
        local_340 = vminps_avx(auVar120,auVar133);
        auVar259 = ZEXT3264(local_340);
        uVar16 = vcmpps_avx512vl(_local_7e0,local_340,2);
        bVar56 = bVar56 & 0x7f & (byte)uVar16;
        if (bVar56 == 0) goto LAB_01cad3c6;
        auVar85 = vmaxps_avx512vl(auVar116,auVar84);
        auVar84 = vfmadd213ps_avx512vl(auVar106,auVar122,auVar114);
        auVar84 = vmulps_avx512vl(auVar110,auVar84);
        auVar106 = vfmadd213ps_avx512vl(local_5e0,auVar122,auVar114);
        auVar40._4_4_ = auVar110._4_4_ * auVar106._4_4_;
        auVar40._0_4_ = auVar110._0_4_ * auVar106._0_4_;
        auVar40._8_4_ = auVar110._8_4_ * auVar106._8_4_;
        auVar40._12_4_ = auVar110._12_4_ * auVar106._12_4_;
        auVar40._16_4_ = auVar110._16_4_ * auVar106._16_4_;
        auVar40._20_4_ = auVar110._20_4_ * auVar106._20_4_;
        auVar40._24_4_ = auVar110._24_4_ * auVar106._24_4_;
        auVar40._28_4_ = auVar132._28_4_;
        auVar84 = vminps_avx512vl(auVar84,auVar102);
        auVar49 = ZEXT812(0);
        auVar106 = ZEXT1232(auVar49) << 0x20;
        auVar84 = vmaxps_avx(auVar84,ZEXT1232(auVar49) << 0x20);
        auVar107 = vminps_avx512vl(auVar40,auVar102);
        auVar41._4_4_ = (auVar84._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar84._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar84._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar84._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar84._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar84._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar84._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar84._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar41,auVar158,auVar236);
        auVar84 = vmaxps_avx(auVar107,ZEXT1232(auVar49) << 0x20);
        auVar42._4_4_ = (auVar84._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar84._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar84._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar84._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar84._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar84._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar84._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar84._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar42,auVar158,auVar236);
        auVar43._4_4_ = auVar85._4_4_ * auVar85._4_4_;
        auVar43._0_4_ = auVar85._0_4_ * auVar85._0_4_;
        auVar43._8_4_ = auVar85._8_4_ * auVar85._8_4_;
        auVar43._12_4_ = auVar85._12_4_ * auVar85._12_4_;
        auVar43._16_4_ = auVar85._16_4_ * auVar85._16_4_;
        auVar43._20_4_ = auVar85._20_4_ * auVar85._20_4_;
        auVar43._24_4_ = auVar85._24_4_ * auVar85._24_4_;
        auVar43._28_4_ = auVar85._28_4_;
        auVar84 = vsubps_avx(local_7c0,auVar43);
        local_8a0 = auVar118._0_4_;
        fStack_89c = auVar118._4_4_;
        fStack_898 = auVar118._8_4_;
        fStack_894 = auVar118._12_4_;
        fStack_890 = auVar118._16_4_;
        fStack_88c = auVar118._20_4_;
        fStack_888 = auVar118._24_4_;
        auVar44._4_4_ = auVar84._4_4_ * fStack_89c;
        auVar44._0_4_ = auVar84._0_4_ * local_8a0;
        auVar44._8_4_ = auVar84._8_4_ * fStack_898;
        auVar44._12_4_ = auVar84._12_4_ * fStack_894;
        auVar44._16_4_ = auVar84._16_4_ * fStack_890;
        auVar44._20_4_ = auVar84._20_4_ * fStack_88c;
        auVar44._24_4_ = auVar84._24_4_ * fStack_888;
        auVar44._28_4_ = auVar85._28_4_;
        auVar85 = vsubps_avx(local_700,auVar44);
        uVar16 = vcmpps_avx512vl(auVar85,ZEXT1232(auVar49) << 0x20,5);
        bVar61 = (byte)uVar16;
        if (bVar61 == 0) {
          bVar61 = 0;
          auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar245 = ZEXT864(0) << 0x20;
          auVar85 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar261 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar134._8_4_ = 0x7f800000;
          auVar134._0_8_ = 0x7f8000007f800000;
          auVar134._12_4_ = 0x7f800000;
          auVar134._16_4_ = 0x7f800000;
          auVar134._20_4_ = 0x7f800000;
          auVar134._24_4_ = 0x7f800000;
          auVar134._28_4_ = 0x7f800000;
          auVar135._8_4_ = 0xff800000;
          auVar135._0_8_ = 0xff800000ff800000;
          auVar135._12_4_ = 0xff800000;
          auVar135._16_4_ = 0xff800000;
          auVar135._20_4_ = 0xff800000;
          auVar135._24_4_ = 0xff800000;
          auVar135._28_4_ = 0xff800000;
        }
        else {
          auVar76 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
          uVar70 = vcmpps_avx512vl(auVar85,auVar116,5);
          auVar85 = vsqrtps_avx(auVar85);
          auVar102 = vfnmadd213ps_avx512vl(auVar124,auVar125,auVar102);
          auVar106 = vfmadd132ps_avx512vl(auVar102,auVar125,auVar125);
          auVar102 = vsubps_avx(_local_600,auVar85);
          auVar108 = vmulps_avx512vl(auVar102,auVar106);
          auVar85 = vsubps_avx512vl(auVar85,auVar123);
          auVar109 = vmulps_avx512vl(auVar85,auVar106);
          auVar85 = vfmadd213ps_avx512vl(auVar122,auVar108,auVar114);
          auVar45._4_4_ = auVar110._4_4_ * auVar85._4_4_;
          auVar45._0_4_ = auVar110._0_4_ * auVar85._0_4_;
          auVar45._8_4_ = auVar110._8_4_ * auVar85._8_4_;
          auVar45._12_4_ = auVar110._12_4_ * auVar85._12_4_;
          auVar45._16_4_ = auVar110._16_4_ * auVar85._16_4_;
          auVar45._20_4_ = auVar110._20_4_ * auVar85._20_4_;
          auVar45._24_4_ = auVar110._24_4_ * auVar85._24_4_;
          auVar45._28_4_ = auVar107._28_4_;
          auVar46._4_4_ = (float)local_580._4_4_ * auVar108._4_4_;
          auVar46._0_4_ = (float)local_580._0_4_ * auVar108._0_4_;
          auVar46._8_4_ = fStack_578 * auVar108._8_4_;
          auVar46._12_4_ = fStack_574 * auVar108._12_4_;
          auVar46._16_4_ = fStack_570 * auVar108._16_4_;
          auVar46._20_4_ = fStack_56c * auVar108._20_4_;
          auVar46._24_4_ = fStack_568 * auVar108._24_4_;
          auVar46._28_4_ = auVar85._28_4_;
          auVar102 = vmulps_avx512vl(local_5a0,auVar108);
          auVar107 = vmulps_avx512vl(local_5c0,auVar108);
          auVar85 = vfmadd213ps_avx512vl(auVar99,auVar45,auVar103);
          auVar85 = vsubps_avx512vl(auVar46,auVar85);
          auVar106 = vfmadd213ps_avx512vl(auVar100,auVar45,auVar104);
          auVar102 = vsubps_avx512vl(auVar102,auVar106);
          auVar75 = vfmadd213ps_fma(auVar45,auVar101,auVar105);
          auVar106 = vsubps_avx(auVar107,ZEXT1632(auVar75));
          auVar261 = auVar106._0_28_;
          auVar106 = vfmadd213ps_avx512vl(auVar122,auVar109,auVar114);
          auVar110 = vmulps_avx512vl(auVar110,auVar106);
          auVar47._4_4_ = (float)local_580._4_4_ * auVar109._4_4_;
          auVar47._0_4_ = (float)local_580._0_4_ * auVar109._0_4_;
          auVar47._8_4_ = fStack_578 * auVar109._8_4_;
          auVar47._12_4_ = fStack_574 * auVar109._12_4_;
          auVar47._16_4_ = fStack_570 * auVar109._16_4_;
          auVar47._20_4_ = fStack_56c * auVar109._20_4_;
          auVar47._24_4_ = fStack_568 * auVar109._24_4_;
          auVar47._28_4_ = auVar107._28_4_;
          auVar107 = vmulps_avx512vl(local_5a0,auVar109);
          auVar111 = vmulps_avx512vl(local_5c0,auVar109);
          auVar75 = vfmadd213ps_fma(auVar99,auVar110,auVar103);
          auVar106 = vsubps_avx(auVar47,ZEXT1632(auVar75));
          auVar75 = vfmadd213ps_fma(auVar100,auVar110,auVar104);
          auVar99 = vsubps_avx512vl(auVar107,ZEXT1632(auVar75));
          auVar75 = vfmadd213ps_fma(auVar101,auVar110,auVar105);
          auVar100 = vsubps_avx512vl(auVar111,ZEXT1632(auVar75));
          auVar245 = ZEXT3264(auVar100);
          auVar159._8_4_ = 0x7f800000;
          auVar159._0_8_ = 0x7f8000007f800000;
          auVar159._12_4_ = 0x7f800000;
          auVar159._16_4_ = 0x7f800000;
          auVar159._20_4_ = 0x7f800000;
          auVar159._24_4_ = 0x7f800000;
          auVar159._28_4_ = 0x7f800000;
          auVar100 = vblendmps_avx512vl(auVar159,auVar108);
          bVar69 = (bool)((byte)uVar70 & 1);
          auVar134._0_4_ = (uint)bVar69 * auVar100._0_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar69 * auVar100._4_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar69 * auVar100._8_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar69 * auVar100._12_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar134._16_4_ = (uint)bVar69 * auVar100._16_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar134._20_4_ = (uint)bVar69 * auVar100._20_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar134._24_4_ = (uint)bVar69 * auVar100._24_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar134._28_4_ = (uint)bVar69 * auVar100._28_4_ | (uint)!bVar69 * 0x7f800000;
          auVar210._8_4_ = 0xff800000;
          auVar210._0_8_ = 0xff800000ff800000;
          auVar210._12_4_ = 0xff800000;
          auVar210._16_4_ = 0xff800000;
          auVar210._20_4_ = 0xff800000;
          auVar210._24_4_ = 0xff800000;
          auVar210._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar210,auVar109);
          bVar69 = (bool)((byte)uVar70 & 1);
          auVar135._0_4_ = (uint)bVar69 * auVar100._0_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar69 * auVar100._4_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar69 * auVar100._8_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar69 * auVar100._12_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar135._16_4_ = (uint)bVar69 * auVar100._16_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar135._20_4_ = (uint)bVar69 * auVar100._20_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar135._24_4_ = (uint)bVar69 * auVar100._24_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar135._28_4_ = (uint)bVar69 * auVar100._28_4_ | (uint)!bVar69 * -0x800000;
          auVar27._8_4_ = 0x36000000;
          auVar27._0_8_ = 0x3600000036000000;
          auVar27._12_4_ = 0x36000000;
          auVar27._16_4_ = 0x36000000;
          auVar27._20_4_ = 0x36000000;
          auVar27._24_4_ = 0x36000000;
          auVar27._28_4_ = 0x36000000;
          auVar100 = vmulps_avx512vl(local_620,auVar27);
          uVar63 = vcmpps_avx512vl(auVar100,local_640,0xe);
          uVar70 = uVar70 & uVar63;
          bVar62 = (byte)uVar70;
          if (bVar62 != 0) {
            uVar63 = vcmpps_avx512vl(auVar84,ZEXT1632(auVar76),2);
            auVar249._8_4_ = 0x7f800000;
            auVar249._0_8_ = 0x7f8000007f800000;
            auVar249._12_4_ = 0x7f800000;
            auVar249._16_4_ = 0x7f800000;
            auVar249._20_4_ = 0x7f800000;
            auVar249._24_4_ = 0x7f800000;
            auVar249._28_4_ = 0x7f800000;
            auVar253._8_4_ = 0xff800000;
            auVar253._0_8_ = 0xff800000ff800000;
            auVar253._12_4_ = 0xff800000;
            auVar253._16_4_ = 0xff800000;
            auVar253._20_4_ = 0xff800000;
            auVar253._24_4_ = 0xff800000;
            auVar253._28_4_ = 0xff800000;
            auVar84 = vblendmps_avx512vl(auVar249,auVar253);
            bVar64 = (byte)uVar63;
            uVar71 = (uint)(bVar64 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar100._0_4_
            ;
            bVar69 = (bool)((byte)(uVar63 >> 1) & 1);
            uVar142 = (uint)bVar69 * auVar84._4_4_ | (uint)!bVar69 * auVar100._4_4_;
            bVar69 = (bool)((byte)(uVar63 >> 2) & 1);
            uVar143 = (uint)bVar69 * auVar84._8_4_ | (uint)!bVar69 * auVar100._8_4_;
            bVar69 = (bool)((byte)(uVar63 >> 3) & 1);
            uVar144 = (uint)bVar69 * auVar84._12_4_ | (uint)!bVar69 * auVar100._12_4_;
            bVar69 = (bool)((byte)(uVar63 >> 4) & 1);
            uVar145 = (uint)bVar69 * auVar84._16_4_ | (uint)!bVar69 * auVar100._16_4_;
            bVar69 = (bool)((byte)(uVar63 >> 5) & 1);
            uVar146 = (uint)bVar69 * auVar84._20_4_ | (uint)!bVar69 * auVar100._20_4_;
            bVar69 = (bool)((byte)(uVar63 >> 6) & 1);
            uVar147 = (uint)bVar69 * auVar84._24_4_ | (uint)!bVar69 * auVar100._24_4_;
            bVar69 = SUB81(uVar63 >> 7,0);
            uVar148 = (uint)bVar69 * auVar84._28_4_ | (uint)!bVar69 * auVar100._28_4_;
            auVar134._0_4_ = (bVar62 & 1) * uVar71 | !(bool)(bVar62 & 1) * auVar134._0_4_;
            bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar134._4_4_ = bVar69 * uVar142 | !bVar69 * auVar134._4_4_;
            bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar134._8_4_ = bVar69 * uVar143 | !bVar69 * auVar134._8_4_;
            bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar134._12_4_ = bVar69 * uVar144 | !bVar69 * auVar134._12_4_;
            bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar134._16_4_ = bVar69 * uVar145 | !bVar69 * auVar134._16_4_;
            bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar134._20_4_ = bVar69 * uVar146 | !bVar69 * auVar134._20_4_;
            bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar134._24_4_ = bVar69 * uVar147 | !bVar69 * auVar134._24_4_;
            bVar69 = SUB81(uVar70 >> 7,0);
            auVar134._28_4_ = bVar69 * uVar148 | !bVar69 * auVar134._28_4_;
            auVar84 = vblendmps_avx512vl(auVar253,auVar249);
            bVar69 = (bool)((byte)(uVar63 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
            bVar11 = SUB81(uVar63 >> 7,0);
            auVar135._0_4_ =
                 (uint)(bVar62 & 1) *
                 ((uint)(bVar64 & 1) * auVar84._0_4_ | !(bool)(bVar64 & 1) * uVar71) |
                 !(bool)(bVar62 & 1) * auVar135._0_4_;
            bVar5 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar135._4_4_ =
                 (uint)bVar5 * ((uint)bVar69 * auVar84._4_4_ | !bVar69 * uVar142) |
                 !bVar5 * auVar135._4_4_;
            bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar135._8_4_ =
                 (uint)bVar69 * ((uint)bVar6 * auVar84._8_4_ | !bVar6 * uVar143) |
                 !bVar69 * auVar135._8_4_;
            bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar135._12_4_ =
                 (uint)bVar69 * ((uint)bVar7 * auVar84._12_4_ | !bVar7 * uVar144) |
                 !bVar69 * auVar135._12_4_;
            bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar135._16_4_ =
                 (uint)bVar69 * ((uint)bVar8 * auVar84._16_4_ | !bVar8 * uVar145) |
                 !bVar69 * auVar135._16_4_;
            bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar135._20_4_ =
                 (uint)bVar69 * ((uint)bVar9 * auVar84._20_4_ | !bVar9 * uVar146) |
                 !bVar69 * auVar135._20_4_;
            bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar135._24_4_ =
                 (uint)bVar69 * ((uint)bVar10 * auVar84._24_4_ | !bVar10 * uVar147) |
                 !bVar69 * auVar135._24_4_;
            bVar69 = SUB81(uVar70 >> 7,0);
            auVar135._28_4_ =
                 (uint)bVar69 * ((uint)bVar11 * auVar84._28_4_ | !bVar11 * uVar148) |
                 !bVar69 * auVar135._28_4_;
            bVar61 = (~bVar62 | bVar64) & bVar61;
          }
        }
        auVar266 = ZEXT3264(local_5c0);
        auVar250._0_4_ = local_5c0._0_4_ * auVar245._0_4_;
        auVar250._4_4_ = local_5c0._4_4_ * auVar245._4_4_;
        auVar250._8_4_ = local_5c0._8_4_ * auVar245._8_4_;
        auVar250._12_4_ = local_5c0._12_4_ * auVar245._12_4_;
        auVar250._16_4_ = local_5c0._16_4_ * auVar245._16_4_;
        auVar250._20_4_ = local_5c0._20_4_ * auVar245._20_4_;
        auVar250._28_36_ = auVar245._28_36_;
        auVar250._24_4_ = local_5c0._24_4_ * auVar245._24_4_;
        auVar254 = ZEXT3264(local_5a0);
        auVar75 = vfmadd231ps_fma(auVar250._0_32_,local_5a0,auVar99);
        auVar250 = ZEXT3264(_local_580);
        auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),_local_580,auVar106);
        auVar246._8_4_ = 0x7fffffff;
        auVar246._0_8_ = 0x7fffffff7fffffff;
        auVar246._12_4_ = 0x7fffffff;
        auVar246._16_4_ = 0x7fffffff;
        auVar246._20_4_ = 0x7fffffff;
        auVar246._24_4_ = 0x7fffffff;
        auVar246._28_4_ = 0x7fffffff;
        auVar84 = vandps_avx(ZEXT1632(auVar75),auVar246);
        auVar263 = ZEXT3264(_local_7e0);
        _local_1c0 = _local_7e0;
        auVar244._8_4_ = 0x3e99999a;
        auVar244._0_8_ = 0x3e99999a3e99999a;
        auVar244._12_4_ = 0x3e99999a;
        auVar244._16_4_ = 0x3e99999a;
        auVar244._20_4_ = 0x3e99999a;
        auVar244._24_4_ = 0x3e99999a;
        auVar244._28_4_ = 0x3e99999a;
        uVar16 = vcmpps_avx512vl(auVar84,auVar244,1);
        local_560._0_2_ = (short)uVar16;
        local_360 = vmaxps_avx(_local_7e0,auVar135);
        auVar84 = vminps_avx(local_340,auVar134);
        uVar16 = vcmpps_avx512vl(_local_7e0,auVar84,2);
        bVar62 = (byte)uVar16 & bVar56;
        uVar17 = vcmpps_avx512vl(local_360,local_340,2);
        if ((bVar56 & ((byte)uVar17 | (byte)uVar16)) == 0) {
          auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
        else {
          auVar48._4_4_ = local_5c0._4_4_ * auVar261._4_4_;
          auVar48._0_4_ = local_5c0._0_4_ * auVar261._0_4_;
          auVar48._8_4_ = local_5c0._8_4_ * auVar261._8_4_;
          auVar48._12_4_ = local_5c0._12_4_ * auVar261._12_4_;
          auVar48._16_4_ = local_5c0._16_4_ * auVar261._16_4_;
          auVar48._20_4_ = local_5c0._20_4_ * auVar261._20_4_;
          auVar48._24_4_ = local_5c0._24_4_ * auVar261._24_4_;
          auVar48._28_4_ = auVar84._28_4_;
          auVar75 = vfmadd213ps_fma(auVar102,local_5a0,auVar48);
          auVar75 = vfmadd213ps_fma(auVar85,_local_580,ZEXT1632(auVar75));
          auVar84 = vandps_avx(ZEXT1632(auVar75),auVar246);
          uVar16 = vcmpps_avx512vl(auVar84,auVar244,1);
          bVar64 = (byte)uVar16 | ~bVar61;
          auVar161._8_4_ = 2;
          auVar161._0_8_ = 0x200000002;
          auVar161._12_4_ = 2;
          auVar161._16_4_ = 2;
          auVar161._20_4_ = 2;
          auVar161._24_4_ = 2;
          auVar161._28_4_ = 2;
          auVar28._8_4_ = 3;
          auVar28._0_8_ = 0x300000003;
          auVar28._12_4_ = 3;
          auVar28._16_4_ = 3;
          auVar28._20_4_ = 3;
          auVar28._24_4_ = 3;
          auVar28._28_4_ = 3;
          auVar84 = vpblendmd_avx512vl(auVar161,auVar28);
          local_300._0_4_ = (uint)(bVar64 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
          bVar69 = (bool)(bVar64 >> 1 & 1);
          local_300._4_4_ = (uint)bVar69 * auVar84._4_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar64 >> 2 & 1);
          local_300._8_4_ = (uint)bVar69 * auVar84._8_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar64 >> 3 & 1);
          local_300._12_4_ = (uint)bVar69 * auVar84._12_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar64 >> 4 & 1);
          local_300._16_4_ = (uint)bVar69 * auVar84._16_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar64 >> 5 & 1);
          local_300._20_4_ = (uint)bVar69 * auVar84._20_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar64 >> 6 & 1);
          local_300._24_4_ = (uint)bVar69 * auVar84._24_4_ | (uint)!bVar69 * 2;
          local_300._28_4_ = (uint)(bVar64 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
          local_4e0 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpd_avx512vl(local_4e0,local_300,5);
          bVar64 = (byte)uVar16 & bVar62;
          auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          if (bVar64 == 0) {
            auVar163._4_4_ = uVar72;
            auVar163._0_4_ = uVar72;
            auVar163._8_4_ = uVar72;
            auVar163._12_4_ = uVar72;
            auVar163._16_4_ = uVar72;
            auVar163._20_4_ = uVar72;
            auVar163._24_4_ = uVar72;
            auVar163._28_4_ = uVar72;
            auVar84 = local_360;
          }
          else {
            local_320 = local_360;
            auVar76 = vminps_avx(local_720._0_16_,local_760._0_16_);
            auVar75 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
            auVar73 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar1 = vminps_avx(auVar76,auVar73);
            auVar76 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar73 = vmaxps_avx(auVar75,auVar76);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar75 = vandps_avx(auVar1,auVar190);
            auVar76 = vandps_avx(auVar73,auVar190);
            auVar75 = vmaxps_avx(auVar75,auVar76);
            auVar76 = vmovshdup_avx(auVar75);
            auVar76 = vmaxss_avx(auVar76,auVar75);
            auVar75 = vshufpd_avx(auVar75,auVar75,1);
            auVar75 = vmaxss_avx(auVar75,auVar76);
            fVar251 = auVar75._0_4_ * 1.9073486e-06;
            local_6b0 = vshufps_avx(auVar73,auVar73,0xff);
            local_540 = (float)local_7e0._0_4_ + fVar165;
            fStack_53c = (float)local_7e0._4_4_ + fVar165;
            fStack_538 = fStack_7d8 + fVar165;
            fStack_534 = fStack_7d4 + fVar165;
            fStack_530 = fStack_7d0 + fVar165;
            fStack_52c = fStack_7cc + fVar165;
            fStack_528 = fStack_7c8 + fVar165;
            fStack_524 = fStack_7c4 + fVar165;
            do {
              auVar162._8_4_ = 0x7f800000;
              auVar162._0_8_ = 0x7f8000007f800000;
              auVar162._12_4_ = 0x7f800000;
              auVar162._16_4_ = 0x7f800000;
              auVar162._20_4_ = 0x7f800000;
              auVar162._24_4_ = 0x7f800000;
              auVar162._28_4_ = 0x7f800000;
              auVar84 = vblendmps_avx512vl(auVar162,_local_7e0);
              auVar137._0_4_ =
                   (uint)(bVar64 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
              bVar69 = (bool)(bVar64 >> 1 & 1);
              auVar137._4_4_ = (uint)bVar69 * auVar84._4_4_ | (uint)!bVar69 * 0x7f800000;
              bVar69 = (bool)(bVar64 >> 2 & 1);
              auVar137._8_4_ = (uint)bVar69 * auVar84._8_4_ | (uint)!bVar69 * 0x7f800000;
              bVar69 = (bool)(bVar64 >> 3 & 1);
              auVar137._12_4_ = (uint)bVar69 * auVar84._12_4_ | (uint)!bVar69 * 0x7f800000;
              bVar69 = (bool)(bVar64 >> 4 & 1);
              auVar137._16_4_ = (uint)bVar69 * auVar84._16_4_ | (uint)!bVar69 * 0x7f800000;
              bVar69 = (bool)(bVar64 >> 5 & 1);
              auVar137._20_4_ = (uint)bVar69 * auVar84._20_4_ | (uint)!bVar69 * 0x7f800000;
              auVar137._24_4_ =
                   (uint)(bVar64 >> 6) * auVar84._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
              auVar137._28_4_ = 0x7f800000;
              auVar84 = vshufps_avx(auVar137,auVar137,0xb1);
              auVar84 = vminps_avx(auVar137,auVar84);
              auVar85 = vshufpd_avx(auVar84,auVar84,5);
              auVar84 = vminps_avx(auVar84,auVar85);
              auVar85 = vpermpd_avx2(auVar84,0x4e);
              auVar84 = vminps_avx(auVar84,auVar85);
              uVar16 = vcmpps_avx512vl(auVar137,auVar84,0);
              bVar57 = (byte)uVar16 & bVar64;
              bVar58 = bVar64;
              if (bVar57 != 0) {
                bVar58 = bVar57;
              }
              iVar19 = 0;
              for (uVar72 = (uint)bVar58; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar72 = *(uint *)(local_1e0 + (uint)(iVar19 << 2));
              uVar71 = *(uint *)(local_1c0 + (uint)(iVar19 << 2));
              fVar255 = auVar14._0_4_;
              if ((float)local_7a0._0_4_ < 0.0) {
                fVar255 = sqrtf((float)local_7a0._0_4_);
              }
              auVar75 = vinsertps_avx(ZEXT416(uVar71),ZEXT416(uVar72),0x10);
              auVar259 = ZEXT1664(auVar75);
              bVar69 = true;
              uVar70 = 0;
              do {
                uVar172 = auVar259._0_4_;
                auVar151._4_4_ = uVar172;
                auVar151._0_4_ = uVar172;
                auVar151._8_4_ = uVar172;
                auVar151._12_4_ = uVar172;
                auVar75 = vfmadd132ps_fma(auVar151,ZEXT816(0) << 0x40,local_790);
                local_700 = auVar259._0_32_;
                auVar76 = vmovshdup_avx(auVar259._0_16_);
                fVar241 = auVar76._0_4_;
                fVar268 = 1.0 - fVar241;
                fVar257 = fVar268 * fVar268 * fVar268;
                fVar217 = fVar241 * fVar241 * fVar241;
                auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar257),
                                          ZEXT416((uint)fVar217));
                fVar256 = fVar241 * fVar268;
                auVar233 = ZEXT416((uint)fVar268);
                auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar256 * fVar241 * 6.0)),
                                          ZEXT416((uint)(fVar256 * fVar268)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                         ZEXT416((uint)fVar257));
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar256 * fVar268 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar256 * fVar241)));
                fVar257 = fVar257 * 0.16666667;
                fVar231 = (auVar73._0_4_ + auVar77._0_4_) * 0.16666667;
                fVar232 = (auVar1._0_4_ + auVar74._0_4_) * 0.16666667;
                fVar217 = fVar217 * 0.16666667;
                auVar191._0_4_ = fVar217 * (float)local_780._0_4_;
                auVar191._4_4_ = fVar217 * (float)local_780._4_4_;
                auVar191._8_4_ = fVar217 * fStack_778;
                auVar191._12_4_ = fVar217 * fStack_774;
                auVar234._4_4_ = fVar232;
                auVar234._0_4_ = fVar232;
                auVar234._8_4_ = fVar232;
                auVar234._12_4_ = fVar232;
                auVar73 = vfmadd132ps_fma(auVar234,auVar191,local_740._0_16_);
                auVar192._4_4_ = fVar231;
                auVar192._0_4_ = fVar231;
                auVar192._8_4_ = fVar231;
                auVar192._12_4_ = fVar231;
                auVar73 = vfmadd132ps_fma(auVar192,auVar73,local_760._0_16_);
                auVar174._4_4_ = fVar257;
                auVar174._0_4_ = fVar257;
                auVar174._8_4_ = fVar257;
                auVar174._12_4_ = fVar257;
                auVar73 = vfmadd132ps_fma(auVar174,auVar73,local_720._0_16_);
                local_5e0._0_16_ = auVar73;
                auVar73 = vsubps_avx(auVar75,auVar73);
                auVar75 = vdpps_avx(auVar73,auVar73,0x7f);
                local_7c0._0_16_ = auVar75;
                if (auVar75._0_4_ < 0.0) {
                  auVar245._0_4_ = sqrtf(auVar75._0_4_);
                  auVar245._4_60_ = extraout_var;
                  auVar75 = auVar245._0_16_;
                }
                else {
                  auVar75 = vsqrtss_avx(auVar75,auVar75);
                }
                local_600._4_4_ = fVar268;
                local_600._0_4_ = fVar268;
                fStack_5f8 = fVar268;
                fStack_5f4 = fVar268;
                auVar77 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar256 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar256 * 4.0)),auVar233,auVar233);
                fVar256 = fVar268 * -fVar268 * 0.5;
                fVar257 = auVar77._0_4_ * 0.5;
                fVar231 = auVar1._0_4_ * 0.5;
                fVar232 = fVar241 * fVar241 * 0.5;
                auVar218._0_4_ = fVar232 * (float)local_780._0_4_;
                auVar218._4_4_ = fVar232 * (float)local_780._4_4_;
                auVar218._8_4_ = fVar232 * fStack_778;
                auVar218._12_4_ = fVar232 * fStack_774;
                auVar175._4_4_ = fVar231;
                auVar175._0_4_ = fVar231;
                auVar175._8_4_ = fVar231;
                auVar175._12_4_ = fVar231;
                auVar1 = vfmadd132ps_fma(auVar175,auVar218,local_740._0_16_);
                auVar193._4_4_ = fVar257;
                auVar193._0_4_ = fVar257;
                auVar193._8_4_ = fVar257;
                auVar193._12_4_ = fVar257;
                auVar1 = vfmadd132ps_fma(auVar193,auVar1,local_760._0_16_);
                auVar264._4_4_ = fVar256;
                auVar264._0_4_ = fVar256;
                auVar264._8_4_ = fVar256;
                auVar264._12_4_ = fVar256;
                auVar1 = vfmadd132ps_fma(auVar264,auVar1,local_720._0_16_);
                local_620._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
                auVar50._12_4_ = 0;
                auVar50._0_12_ = ZEXT812(0);
                fVar256 = local_620._0_4_;
                auVar77 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar256));
                fVar257 = auVar77._0_4_;
                local_640._0_16_ = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar256));
                auVar77 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
                uVar72 = auVar75._0_4_;
                if (fVar256 < -fVar256) {
                  fVar231 = sqrtf(fVar256);
                  auVar75 = ZEXT416(uVar72);
                }
                else {
                  auVar74 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                  fVar231 = auVar74._0_4_;
                }
                fVar256 = fVar257 * 1.5 + fVar256 * -0.5 * fVar257 * fVar257 * fVar257;
                auVar152._0_4_ = auVar1._0_4_ * fVar256;
                auVar152._4_4_ = auVar1._4_4_ * fVar256;
                auVar152._8_4_ = auVar1._8_4_ * fVar256;
                auVar152._12_4_ = auVar1._12_4_ * fVar256;
                auVar74 = vdpps_avx(auVar73,auVar152,0x7f);
                fVar217 = auVar75._0_4_;
                fVar257 = auVar74._0_4_;
                auVar153._0_4_ = fVar257 * fVar257;
                auVar153._4_4_ = auVar74._4_4_ * auVar74._4_4_;
                auVar153._8_4_ = auVar74._8_4_ * auVar74._8_4_;
                auVar153._12_4_ = auVar74._12_4_ * auVar74._12_4_;
                auVar81 = vsubps_avx(local_7c0._0_16_,auVar153);
                fVar232 = auVar81._0_4_;
                auVar176._4_12_ = ZEXT812(0) << 0x20;
                auVar176._0_4_ = fVar232;
                auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
                auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                auVar80 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                if (fVar232 < 0.0) {
                  local_670._0_4_ = fVar231;
                  local_690._0_4_ = auVar79._0_4_;
                  local_6a0._4_4_ = fVar256;
                  local_6a0._0_4_ = fVar256;
                  fStack_698 = fVar256;
                  fStack_694 = fVar256;
                  local_680 = auVar78;
                  fVar232 = sqrtf(fVar232);
                  auVar80 = ZEXT416(auVar80._0_4_);
                  auVar79 = ZEXT416((uint)local_690._0_4_);
                  auVar75 = ZEXT416(uVar72);
                  auVar78 = local_680;
                  fVar256 = (float)local_6a0._0_4_;
                  fVar268 = (float)local_6a0._4_4_;
                  fVar241 = fStack_698;
                  fVar269 = fStack_694;
                  fVar231 = (float)local_670._0_4_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar232 = auVar81._0_4_;
                  fVar268 = fVar256;
                  fVar241 = fVar256;
                  fVar269 = fVar256;
                }
                auVar266 = ZEXT1664(auVar1);
                auVar263 = ZEXT1664(local_7c0._0_16_);
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar233,auVar76);
                auVar233 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0000000),0),auVar233);
                auVar83 = local_700._0_16_;
                auVar76 = vshufps_avx(auVar83,auVar83,0x55);
                auVar194._0_4_ = auVar76._0_4_ * (float)local_780._0_4_;
                auVar194._4_4_ = auVar76._4_4_ * (float)local_780._4_4_;
                auVar194._8_4_ = auVar76._8_4_ * fStack_778;
                auVar194._12_4_ = auVar76._12_4_ * fStack_774;
                auVar219._0_4_ = auVar233._0_4_;
                auVar219._4_4_ = auVar219._0_4_;
                auVar219._8_4_ = auVar219._0_4_;
                auVar219._12_4_ = auVar219._0_4_;
                auVar76 = vfmadd132ps_fma(auVar219,auVar194,local_740._0_16_);
                auVar177._0_4_ = auVar81._0_4_;
                auVar177._4_4_ = auVar177._0_4_;
                auVar177._8_4_ = auVar177._0_4_;
                auVar177._12_4_ = auVar177._0_4_;
                auVar76 = vfmadd132ps_fma(auVar177,auVar76,local_760._0_16_);
                auVar76 = vfmadd132ps_fma(_local_600,auVar76,local_720._0_16_);
                auVar178._0_4_ = auVar76._0_4_ * (float)local_620._0_4_;
                auVar178._4_4_ = auVar76._4_4_ * (float)local_620._0_4_;
                auVar178._8_4_ = auVar76._8_4_ * (float)local_620._0_4_;
                auVar178._12_4_ = auVar76._12_4_ * (float)local_620._0_4_;
                auVar76 = vdpps_avx(auVar1,auVar76,0x7f);
                fVar189 = auVar76._0_4_;
                auVar195._0_4_ = auVar1._0_4_ * fVar189;
                auVar195._4_4_ = auVar1._4_4_ * fVar189;
                auVar195._8_4_ = auVar1._8_4_ * fVar189;
                auVar195._12_4_ = auVar1._12_4_ * fVar189;
                auVar76 = vsubps_avx(auVar178,auVar195);
                fVar189 = auVar77._0_4_ * (float)local_640._0_4_;
                auVar233 = vmaxss_avx(ZEXT416((uint)fVar251),
                                      ZEXT416((uint)(local_700._0_4_ * fVar255 * 1.9073486e-06)));
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar81 = vxorps_avx512vl(auVar1,auVar20);
                auVar196._0_4_ = fVar256 * auVar76._0_4_ * fVar189;
                auVar196._4_4_ = fVar268 * auVar76._4_4_ * fVar189;
                auVar196._8_4_ = fVar241 * auVar76._8_4_ * fVar189;
                auVar196._12_4_ = fVar269 * auVar76._12_4_ * fVar189;
                auVar76 = vdpps_avx(auVar81,auVar152,0x7f);
                auVar77 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar251),auVar233);
                auVar75 = vdpps_avx(auVar73,auVar196,0x7f);
                auVar82 = vfmadd213ss_fma(ZEXT416((uint)(fVar217 + 1.0)),
                                          ZEXT416((uint)(fVar251 / fVar231)),auVar77);
                fVar256 = auVar76._0_4_ + auVar75._0_4_;
                auVar75 = vdpps_avx(local_790,auVar152,0x7f);
                auVar76 = vdpps_avx(auVar73,auVar81,0x7f);
                auVar77 = vmulss_avx512f(auVar80,auVar78);
                auVar79 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar77._0_4_ *
                                                               auVar78._0_4_ * auVar78._0_4_)));
                auVar77 = vdpps_avx(auVar73,local_790,0x7f);
                auVar78 = vfnmadd231ss_fma(auVar76,auVar74,ZEXT416((uint)fVar256));
                auVar77 = vfnmadd231ss_fma(auVar77,auVar74,auVar75);
                auVar76 = vpermilps_avx(local_5e0._0_16_,0xff);
                fVar232 = fVar232 - auVar76._0_4_;
                auVar81 = vshufps_avx(auVar1,auVar1,0xff);
                auVar76 = vfmsub213ss_fma(auVar78,auVar79,auVar81);
                auVar252._8_4_ = 0x80000000;
                auVar252._0_8_ = 0x8000000080000000;
                auVar252._12_4_ = 0x80000000;
                auVar254 = ZEXT1664(auVar252);
                auVar247._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = auVar76._8_4_ ^ 0x80000000;
                auVar247._12_4_ = auVar76._12_4_ ^ 0x80000000;
                auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar79._0_4_));
                auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_)),
                                          ZEXT416((uint)fVar256),auVar77);
                auVar76 = vinsertps_avx(auVar247,auVar77,0x1c);
                auVar242._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                auVar242._8_4_ = auVar75._8_4_ ^ 0x80000000;
                auVar242._12_4_ = auVar75._12_4_ ^ 0x80000000;
                auVar77 = vinsertps_avx(ZEXT416((uint)fVar256),auVar242,0x10);
                auVar220._0_4_ = auVar78._0_4_;
                auVar220._4_4_ = auVar220._0_4_;
                auVar220._8_4_ = auVar220._0_4_;
                auVar220._12_4_ = auVar220._0_4_;
                auVar75 = vdivps_avx(auVar76,auVar220);
                auVar76 = vdivps_avx(auVar77,auVar220);
                auVar221._0_4_ = fVar257 * auVar75._0_4_ + fVar232 * auVar76._0_4_;
                auVar221._4_4_ = fVar257 * auVar75._4_4_ + fVar232 * auVar76._4_4_;
                auVar221._8_4_ = fVar257 * auVar75._8_4_ + fVar232 * auVar76._8_4_;
                auVar221._12_4_ = fVar257 * auVar75._12_4_ + fVar232 * auVar76._12_4_;
                auVar75 = vsubps_avx(auVar83,auVar221);
                auVar259 = ZEXT1664(auVar75);
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar76 = vandps_avx512vl(auVar74,auVar21);
                if (auVar76._0_4_ < auVar82._0_4_) {
                  auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ + auVar233._0_4_)),
                                            local_6b0,ZEXT416(0x36000000));
                  auVar22._8_4_ = 0x7fffffff;
                  auVar22._0_8_ = 0x7fffffff7fffffff;
                  auVar22._12_4_ = 0x7fffffff;
                  auVar77 = vandps_avx512vl(ZEXT416((uint)fVar232),auVar22);
                  if (auVar77._0_4_ < auVar76._0_4_) {
                    fVar255 = auVar75._0_4_ + (float)local_6c0._0_4_;
                    auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar255 < fVar149) {
LAB_01cadecd:
                      bVar58 = 0;
                      goto LAB_01cadef7;
                    }
                    fVar256 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar255 <= fVar256) {
                      auVar76 = vmovshdup_avx(auVar75);
                      bVar58 = 0;
                      if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01cadef7;
                      auVar222._0_12_ = ZEXT812(0);
                      auVar222._12_4_ = 0;
                      auVar197._4_8_ = auVar222._4_8_;
                      auVar197._0_4_ = local_7c0._0_4_;
                      auVar197._12_4_ = 0;
                      auVar76 = vrsqrt14ss_avx512f(auVar222,auVar197);
                      fVar257 = auVar76._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar67].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01cadecd;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar58 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01cadef7;
                      fVar257 = fVar257 * 1.5 + local_7c0._0_4_ * -0.5 * fVar257 * fVar257 * fVar257
                      ;
                      auVar198._0_4_ = auVar73._0_4_ * fVar257;
                      auVar198._4_4_ = auVar73._4_4_ * fVar257;
                      auVar198._8_4_ = auVar73._8_4_ * fVar257;
                      auVar198._12_4_ = auVar73._12_4_ * fVar257;
                      auVar74 = vfmadd213ps_fma(auVar81,auVar198,auVar1);
                      auVar76 = vshufps_avx(auVar198,auVar198,0xc9);
                      auVar73 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar199._0_4_ = auVar198._0_4_ * auVar73._0_4_;
                      auVar199._4_4_ = auVar198._4_4_ * auVar73._4_4_;
                      auVar199._8_4_ = auVar198._8_4_ * auVar73._8_4_;
                      auVar199._12_4_ = auVar198._12_4_ * auVar73._12_4_;
                      auVar77 = vfmsub231ps_fma(auVar199,auVar1,auVar76);
                      auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                      auVar73 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                      auVar154._0_4_ = auVar74._0_4_ * auVar77._0_4_;
                      auVar154._4_4_ = auVar74._4_4_ * auVar77._4_4_;
                      auVar154._8_4_ = auVar74._8_4_ * auVar77._8_4_;
                      auVar154._12_4_ = auVar74._12_4_ * auVar77._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar154,auVar76,auVar73);
                      auVar229._8_4_ = 1;
                      auVar229._0_8_ = 0x100000001;
                      auVar229._12_4_ = 1;
                      auVar229._16_4_ = 1;
                      auVar229._20_4_ = 1;
                      auVar229._24_4_ = 1;
                      auVar229._28_4_ = 1;
                      local_420 = vpermps_avx2(auVar229,ZEXT1632(auVar75));
                      auVar84 = vpermps_avx2(auVar229,ZEXT1632(auVar76));
                      auVar239._8_4_ = 2;
                      auVar239._0_8_ = 0x200000002;
                      auVar239._12_4_ = 2;
                      auVar239._16_4_ = 2;
                      auVar239._20_4_ = 2;
                      auVar239._24_4_ = 2;
                      auVar239._28_4_ = 2;
                      local_460 = vpermps_avx2(auVar239,ZEXT1632(auVar76));
                      local_440 = auVar76._0_4_;
                      local_480[0] = (RTCHitN)auVar84[0];
                      local_480[1] = (RTCHitN)auVar84[1];
                      local_480[2] = (RTCHitN)auVar84[2];
                      local_480[3] = (RTCHitN)auVar84[3];
                      local_480[4] = (RTCHitN)auVar84[4];
                      local_480[5] = (RTCHitN)auVar84[5];
                      local_480[6] = (RTCHitN)auVar84[6];
                      local_480[7] = (RTCHitN)auVar84[7];
                      local_480[8] = (RTCHitN)auVar84[8];
                      local_480[9] = (RTCHitN)auVar84[9];
                      local_480[10] = (RTCHitN)auVar84[10];
                      local_480[0xb] = (RTCHitN)auVar84[0xb];
                      local_480[0xc] = (RTCHitN)auVar84[0xc];
                      local_480[0xd] = (RTCHitN)auVar84[0xd];
                      local_480[0xe] = (RTCHitN)auVar84[0xe];
                      local_480[0xf] = (RTCHitN)auVar84[0xf];
                      local_480[0x10] = (RTCHitN)auVar84[0x10];
                      local_480[0x11] = (RTCHitN)auVar84[0x11];
                      local_480[0x12] = (RTCHitN)auVar84[0x12];
                      local_480[0x13] = (RTCHitN)auVar84[0x13];
                      local_480[0x14] = (RTCHitN)auVar84[0x14];
                      local_480[0x15] = (RTCHitN)auVar84[0x15];
                      local_480[0x16] = (RTCHitN)auVar84[0x16];
                      local_480[0x17] = (RTCHitN)auVar84[0x17];
                      local_480[0x18] = (RTCHitN)auVar84[0x18];
                      local_480[0x19] = (RTCHitN)auVar84[0x19];
                      local_480[0x1a] = (RTCHitN)auVar84[0x1a];
                      local_480[0x1b] = (RTCHitN)auVar84[0x1b];
                      local_480[0x1c] = (RTCHitN)auVar84[0x1c];
                      local_480[0x1d] = (RTCHitN)auVar84[0x1d];
                      local_480[0x1e] = (RTCHitN)auVar84[0x1e];
                      local_480[0x1f] = (RTCHitN)auVar84[0x1f];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_400 = ZEXT432(0) << 0x20;
                      local_3e0 = local_4a0._0_8_;
                      uStack_3d8 = local_4a0._8_8_;
                      uStack_3d0 = local_4a0._16_8_;
                      uStack_3c8 = local_4a0._24_8_;
                      local_3c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_3a0 = context->user->instID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_380 = context->user->instPrimID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      *(float *)(ray + k * 4 + 0x100) = fVar255;
                      local_6e0 = local_500;
                      local_810.valid = (int *)local_6e0;
                      local_810.geometryUserPtr = pGVar3->userPtr;
                      local_810.context = context->user;
                      local_810.hit = local_480;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar254 = ZEXT1664(auVar252);
                        auVar259 = ZEXT1664(auVar75);
                        auVar263 = ZEXT1664(local_7c0._0_16_);
                        auVar266 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_810);
                        auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      }
                      if (local_6e0 != (undefined1  [32])0x0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar254 = ZEXT1664(auVar254._0_16_);
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar263 = ZEXT1664(auVar263._0_16_);
                          auVar266 = ZEXT1664(auVar266._0_16_);
                          (*p_Var4)(&local_810);
                          auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        }
                        uVar70 = vptestmd_avx512vl(local_6e0,local_6e0);
                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar70 & 1);
                        bVar6 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar70 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar70 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar70 >> 6) & 1);
                        bVar12 = SUB81(uVar70 >> 7,0);
                        *(uint *)(local_810.ray + 0x100) =
                             (uint)bVar5 * auVar84._0_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x100);
                        *(uint *)(local_810.ray + 0x104) =
                             (uint)bVar6 * auVar84._4_4_ |
                             (uint)!bVar6 * *(int *)(local_810.ray + 0x104);
                        *(uint *)(local_810.ray + 0x108) =
                             (uint)bVar7 * auVar84._8_4_ |
                             (uint)!bVar7 * *(int *)(local_810.ray + 0x108);
                        *(uint *)(local_810.ray + 0x10c) =
                             (uint)bVar8 * auVar84._12_4_ |
                             (uint)!bVar8 * *(int *)(local_810.ray + 0x10c);
                        *(uint *)(local_810.ray + 0x110) =
                             (uint)bVar9 * auVar84._16_4_ |
                             (uint)!bVar9 * *(int *)(local_810.ray + 0x110);
                        *(uint *)(local_810.ray + 0x114) =
                             (uint)bVar10 * auVar84._20_4_ |
                             (uint)!bVar10 * *(int *)(local_810.ray + 0x114);
                        *(uint *)(local_810.ray + 0x118) =
                             (uint)bVar11 * auVar84._24_4_ |
                             (uint)!bVar11 * *(int *)(local_810.ray + 0x118);
                        *(uint *)(local_810.ray + 0x11c) =
                             (uint)bVar12 * auVar84._28_4_ |
                             (uint)!bVar12 * *(int *)(local_810.ray + 0x11c);
                        bVar58 = 1;
                        if (local_6e0 != (undefined1  [32])0x0) goto LAB_01cadef7;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar256;
                    }
                    bVar58 = 0;
                    goto LAB_01cadef7;
                  }
                }
                bVar69 = uVar70 < 4;
                uVar70 = uVar70 + 1;
              } while (uVar70 != 5);
              bVar69 = false;
              auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar58 = 5;
LAB_01cadef7:
              bVar68 = (bool)(bVar68 | bVar69 & bVar58);
              uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar163._4_4_ = uVar172;
              auVar163._0_4_ = uVar172;
              auVar163._8_4_ = uVar172;
              auVar163._12_4_ = uVar172;
              auVar163._16_4_ = uVar172;
              auVar163._20_4_ = uVar172;
              auVar163._24_4_ = uVar172;
              auVar163._28_4_ = uVar172;
              auVar52._4_4_ = fStack_53c;
              auVar52._0_4_ = local_540;
              auVar52._8_4_ = fStack_538;
              auVar52._12_4_ = fStack_534;
              auVar52._16_4_ = fStack_530;
              auVar52._20_4_ = fStack_52c;
              auVar52._24_4_ = fStack_528;
              auVar52._28_4_ = fStack_524;
              uVar16 = vcmpps_avx512vl(auVar163,auVar52,0xd);
              bVar64 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar64 & (byte)uVar16;
              auVar84 = local_320;
            } while (bVar64 != 0);
          }
          auVar250 = ZEXT3264(local_360);
          bVar61 = local_560[0] | ~bVar61;
          auVar186._0_4_ = fVar165 + auVar84._0_4_;
          auVar186._4_4_ = fVar165 + auVar84._4_4_;
          auVar186._8_4_ = fVar165 + auVar84._8_4_;
          auVar186._12_4_ = fVar165 + auVar84._12_4_;
          auVar186._16_4_ = fVar165 + auVar84._16_4_;
          auVar186._20_4_ = fVar165 + auVar84._20_4_;
          auVar186._24_4_ = fVar165 + auVar84._24_4_;
          auVar186._28_4_ = fVar165 + auVar84._28_4_;
          uVar16 = vcmpps_avx512vl(auVar186,auVar163,2);
          bVar64 = (byte)uVar17 & bVar56 & (byte)uVar16;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar84 = vpblendmd_avx512vl(auVar187,auVar29);
          auVar138._0_4_ = (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
          bVar69 = (bool)(bVar61 >> 1 & 1);
          auVar138._4_4_ = (uint)bVar69 * auVar84._4_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar61 >> 2 & 1);
          auVar138._8_4_ = (uint)bVar69 * auVar84._8_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar61 >> 3 & 1);
          auVar138._12_4_ = (uint)bVar69 * auVar84._12_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar61 >> 4 & 1);
          auVar138._16_4_ = (uint)bVar69 * auVar84._16_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar61 >> 5 & 1);
          auVar138._20_4_ = (uint)bVar69 * auVar84._20_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar61 >> 6 & 1);
          auVar138._24_4_ = (uint)bVar69 * auVar84._24_4_ | (uint)!bVar69 * 2;
          auVar138._28_4_ = (uint)(bVar61 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
          uVar16 = vpcmpd_avx512vl(local_4e0,auVar138,5);
          bVar56 = (byte)uVar16 & bVar64;
          if (bVar56 != 0) {
            auVar76 = vminps_avx(local_720._0_16_,local_760._0_16_);
            auVar75 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
            auVar73 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar1 = vminps_avx(auVar76,auVar73);
            auVar76 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar73 = vmaxps_avx(auVar75,auVar76);
            auVar200._8_4_ = 0x7fffffff;
            auVar200._0_8_ = 0x7fffffff7fffffff;
            auVar200._12_4_ = 0x7fffffff;
            auVar75 = vandps_avx(auVar1,auVar200);
            auVar76 = vandps_avx(auVar73,auVar200);
            auVar75 = vmaxps_avx(auVar75,auVar76);
            auVar76 = vmovshdup_avx(auVar75);
            auVar76 = vmaxss_avx(auVar76,auVar75);
            auVar75 = vshufpd_avx(auVar75,auVar75,1);
            auVar75 = vmaxss_avx(auVar75,auVar76);
            fVar251 = auVar75._0_4_ * 1.9073486e-06;
            local_6b0 = vshufps_avx(auVar73,auVar73,0xff);
            local_540 = fVar165 + local_360._0_4_;
            fStack_53c = fVar165 + local_360._4_4_;
            fStack_538 = fVar165 + local_360._8_4_;
            fStack_534 = fVar165 + local_360._12_4_;
            fStack_530 = fVar165 + local_360._16_4_;
            fStack_52c = fVar165 + local_360._20_4_;
            fStack_528 = fVar165 + local_360._24_4_;
            fStack_524 = fVar165 + local_360._28_4_;
            _local_7e0 = local_360;
            local_560 = auVar138;
            do {
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar84 = vblendmps_avx512vl(auVar164,auVar250._0_32_);
              auVar139._0_4_ =
                   (uint)(bVar56 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar56 & 1) * 0x7f800000;
              bVar69 = (bool)(bVar56 >> 1 & 1);
              auVar139._4_4_ = (uint)bVar69 * auVar84._4_4_ | (uint)!bVar69 * 0x7f800000;
              bVar69 = (bool)(bVar56 >> 2 & 1);
              auVar139._8_4_ = (uint)bVar69 * auVar84._8_4_ | (uint)!bVar69 * 0x7f800000;
              bVar69 = (bool)(bVar56 >> 3 & 1);
              auVar139._12_4_ = (uint)bVar69 * auVar84._12_4_ | (uint)!bVar69 * 0x7f800000;
              bVar69 = (bool)(bVar56 >> 4 & 1);
              auVar139._16_4_ = (uint)bVar69 * auVar84._16_4_ | (uint)!bVar69 * 0x7f800000;
              bVar69 = (bool)(bVar56 >> 5 & 1);
              auVar139._20_4_ = (uint)bVar69 * auVar84._20_4_ | (uint)!bVar69 * 0x7f800000;
              auVar139._24_4_ =
                   (uint)(bVar56 >> 6) * auVar84._24_4_ | (uint)!(bool)(bVar56 >> 6) * 0x7f800000;
              auVar139._28_4_ = 0x7f800000;
              auVar84 = vshufps_avx(auVar139,auVar139,0xb1);
              auVar84 = vminps_avx(auVar139,auVar84);
              auVar85 = vshufpd_avx(auVar84,auVar84,5);
              auVar84 = vminps_avx(auVar84,auVar85);
              auVar85 = vpermpd_avx2(auVar84,0x4e);
              auVar84 = vminps_avx(auVar84,auVar85);
              uVar16 = vcmpps_avx512vl(auVar139,auVar84,0);
              bVar58 = (byte)uVar16 & bVar56;
              bVar61 = bVar56;
              if (bVar58 != 0) {
                bVar61 = bVar58;
              }
              iVar19 = 0;
              for (uVar72 = (uint)bVar61; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar72 = *(uint *)(local_200 + (uint)(iVar19 << 2));
              uVar71 = *(uint *)(local_340 + (uint)(iVar19 << 2));
              fVar255 = auVar13._0_4_;
              if ((float)local_7a0._0_4_ < 0.0) {
                fVar255 = sqrtf((float)local_7a0._0_4_);
              }
              auVar75 = vinsertps_avx(ZEXT416(uVar71),ZEXT416(uVar72),0x10);
              auVar259 = ZEXT1664(auVar75);
              bVar69 = true;
              uVar70 = 0;
              do {
                uVar172 = auVar259._0_4_;
                auVar155._4_4_ = uVar172;
                auVar155._0_4_ = uVar172;
                auVar155._8_4_ = uVar172;
                auVar155._12_4_ = uVar172;
                auVar75 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_790);
                local_700 = auVar259._0_32_;
                auVar76 = vmovshdup_avx(auVar259._0_16_);
                fVar241 = auVar76._0_4_;
                fVar268 = 1.0 - fVar241;
                fVar257 = fVar268 * fVar268 * fVar268;
                fVar217 = fVar241 * fVar241 * fVar241;
                auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar257),
                                          ZEXT416((uint)fVar217));
                fVar256 = fVar241 * fVar268;
                auVar233 = ZEXT416((uint)fVar268);
                auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar256 * fVar241 * 6.0)),
                                          ZEXT416((uint)(fVar256 * fVar268)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                         ZEXT416((uint)fVar257));
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar256 * fVar268 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar256 * fVar241)));
                fVar257 = fVar257 * 0.16666667;
                fVar231 = (auVar73._0_4_ + auVar77._0_4_) * 0.16666667;
                fVar232 = (auVar1._0_4_ + auVar74._0_4_) * 0.16666667;
                fVar217 = fVar217 * 0.16666667;
                auVar201._0_4_ = fVar217 * (float)local_780._0_4_;
                auVar201._4_4_ = fVar217 * (float)local_780._4_4_;
                auVar201._8_4_ = fVar217 * fStack_778;
                auVar201._12_4_ = fVar217 * fStack_774;
                auVar235._4_4_ = fVar232;
                auVar235._0_4_ = fVar232;
                auVar235._8_4_ = fVar232;
                auVar235._12_4_ = fVar232;
                auVar73 = vfmadd132ps_fma(auVar235,auVar201,local_740._0_16_);
                auVar202._4_4_ = fVar231;
                auVar202._0_4_ = fVar231;
                auVar202._8_4_ = fVar231;
                auVar202._12_4_ = fVar231;
                auVar73 = vfmadd132ps_fma(auVar202,auVar73,local_760._0_16_);
                auVar179._4_4_ = fVar257;
                auVar179._0_4_ = fVar257;
                auVar179._8_4_ = fVar257;
                auVar179._12_4_ = fVar257;
                auVar73 = vfmadd132ps_fma(auVar179,auVar73,local_720._0_16_);
                local_5e0._0_16_ = auVar73;
                auVar73 = vsubps_avx(auVar75,auVar73);
                auVar75 = vdpps_avx(auVar73,auVar73,0x7f);
                local_7c0._0_16_ = auVar75;
                if (auVar75._0_4_ < 0.0) {
                  auVar254._0_4_ = sqrtf(auVar75._0_4_);
                  auVar254._4_60_ = extraout_var_00;
                  auVar75 = auVar254._0_16_;
                }
                else {
                  auVar75 = vsqrtss_avx(auVar75,auVar75);
                }
                local_600._4_4_ = fVar268;
                local_600._0_4_ = fVar268;
                fStack_5f8 = fVar268;
                fStack_5f4 = fVar268;
                auVar77 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar256 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar256 * 4.0)),auVar233,auVar233);
                fVar256 = fVar268 * -fVar268 * 0.5;
                fVar257 = auVar77._0_4_ * 0.5;
                fVar231 = auVar1._0_4_ * 0.5;
                fVar232 = fVar241 * fVar241 * 0.5;
                auVar223._0_4_ = fVar232 * (float)local_780._0_4_;
                auVar223._4_4_ = fVar232 * (float)local_780._4_4_;
                auVar223._8_4_ = fVar232 * fStack_778;
                auVar223._12_4_ = fVar232 * fStack_774;
                auVar180._4_4_ = fVar231;
                auVar180._0_4_ = fVar231;
                auVar180._8_4_ = fVar231;
                auVar180._12_4_ = fVar231;
                auVar1 = vfmadd132ps_fma(auVar180,auVar223,local_740._0_16_);
                auVar203._4_4_ = fVar257;
                auVar203._0_4_ = fVar257;
                auVar203._8_4_ = fVar257;
                auVar203._12_4_ = fVar257;
                auVar1 = vfmadd132ps_fma(auVar203,auVar1,local_760._0_16_);
                auVar265._4_4_ = fVar256;
                auVar265._0_4_ = fVar256;
                auVar265._8_4_ = fVar256;
                auVar265._12_4_ = fVar256;
                auVar1 = vfmadd132ps_fma(auVar265,auVar1,local_720._0_16_);
                local_620._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
                auVar51._12_4_ = 0;
                auVar51._0_12_ = ZEXT812(0);
                fVar256 = local_620._0_4_;
                auVar77 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar256));
                fVar257 = auVar77._0_4_;
                local_640._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar256));
                auVar77 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
                uVar72 = auVar75._0_4_;
                if (fVar256 < -fVar256) {
                  fVar231 = sqrtf(fVar256);
                  auVar75 = ZEXT416(uVar72);
                }
                else {
                  auVar74 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                  fVar231 = auVar74._0_4_;
                }
                auVar80 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(fVar257 * 1.5 +
                                                   fVar256 * -0.5 * fVar257 * fVar257 * fVar257)));
                auVar79 = vmulps_avx512vl(auVar1,auVar80);
                auVar74 = vdpps_avx(auVar73,auVar79,0x7f);
                fVar232 = auVar75._0_4_;
                fVar256 = auVar74._0_4_;
                auVar156._0_4_ = fVar256 * fVar256;
                auVar156._4_4_ = auVar74._4_4_ * auVar74._4_4_;
                auVar156._8_4_ = auVar74._8_4_ * auVar74._8_4_;
                auVar156._12_4_ = auVar74._12_4_ * auVar74._12_4_;
                auVar81 = vsubps_avx(local_7c0._0_16_,auVar156);
                fVar257 = auVar81._0_4_;
                auVar181._4_12_ = ZEXT812(0) << 0x20;
                auVar181._0_4_ = fVar257;
                auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
                auVar82 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                auVar83 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                if (fVar257 < 0.0) {
                  local_680._0_4_ = auVar82._0_4_;
                  _local_6a0 = auVar80;
                  local_690 = auVar79;
                  local_670 = auVar78;
                  fVar257 = sqrtf(fVar257);
                  auVar83 = ZEXT416(auVar83._0_4_);
                  auVar82 = ZEXT416((uint)local_680._0_4_);
                  auVar75 = ZEXT416(uVar72);
                  auVar78 = local_670;
                  auVar79 = local_690;
                  auVar80 = _local_6a0;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar257 = auVar81._0_4_;
                }
                auVar266 = ZEXT1664(auVar1);
                auVar263 = ZEXT1664(local_7c0._0_16_);
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar233,auVar76);
                auVar233 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0000000),0),auVar233);
                auVar258 = local_700._0_16_;
                auVar76 = vshufps_avx(auVar258,auVar258,0x55);
                auVar204._0_4_ = auVar76._0_4_ * (float)local_780._0_4_;
                auVar204._4_4_ = auVar76._4_4_ * (float)local_780._4_4_;
                auVar204._8_4_ = auVar76._8_4_ * fStack_778;
                auVar204._12_4_ = auVar76._12_4_ * fStack_774;
                auVar224._0_4_ = auVar233._0_4_;
                auVar224._4_4_ = auVar224._0_4_;
                auVar224._8_4_ = auVar224._0_4_;
                auVar224._12_4_ = auVar224._0_4_;
                auVar76 = vfmadd132ps_fma(auVar224,auVar204,local_740._0_16_);
                auVar182._0_4_ = auVar81._0_4_;
                auVar182._4_4_ = auVar182._0_4_;
                auVar182._8_4_ = auVar182._0_4_;
                auVar182._12_4_ = auVar182._0_4_;
                auVar76 = vfmadd132ps_fma(auVar182,auVar76,local_760._0_16_);
                auVar76 = vfmadd132ps_fma(_local_600,auVar76,local_720._0_16_);
                auVar183._0_4_ = auVar76._0_4_ * (float)local_620._0_4_;
                auVar183._4_4_ = auVar76._4_4_ * (float)local_620._0_4_;
                auVar183._8_4_ = auVar76._8_4_ * (float)local_620._0_4_;
                auVar183._12_4_ = auVar76._12_4_ * (float)local_620._0_4_;
                auVar76 = vdpps_avx(auVar1,auVar76,0x7f);
                fVar217 = auVar76._0_4_;
                auVar205._0_4_ = auVar1._0_4_ * fVar217;
                auVar205._4_4_ = auVar1._4_4_ * fVar217;
                auVar205._8_4_ = auVar1._8_4_ * fVar217;
                auVar205._12_4_ = auVar1._12_4_ * fVar217;
                auVar76 = vsubps_avx(auVar183,auVar205);
                fVar217 = auVar77._0_4_ * (float)local_640._0_4_;
                auVar233 = vmaxss_avx(ZEXT416((uint)fVar251),
                                      ZEXT416((uint)(local_700._0_4_ * fVar255 * 1.9073486e-06)));
                auVar206._0_4_ = auVar76._0_4_ * fVar217;
                auVar206._4_4_ = auVar76._4_4_ * fVar217;
                auVar206._8_4_ = auVar76._8_4_ * fVar217;
                auVar206._12_4_ = auVar76._12_4_ * fVar217;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar81 = vxorps_avx512vl(auVar1,auVar23);
                auVar80 = vmulps_avx512vl(auVar80,auVar206);
                auVar76 = vdpps_avx(auVar81,auVar79,0x7f);
                auVar77 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar251),auVar233);
                auVar75 = vdpps_avx(auVar73,auVar80,0x7f);
                auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar232 + 1.0)),
                                          ZEXT416((uint)(fVar251 / fVar231)),auVar77);
                fVar231 = auVar76._0_4_ + auVar75._0_4_;
                auVar75 = vdpps_avx(local_790,auVar79,0x7f);
                auVar76 = vdpps_avx(auVar73,auVar81,0x7f);
                auVar77 = vmulss_avx512f(auVar83,auVar78);
                auVar79 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar77._0_4_ *
                                                               auVar78._0_4_ * auVar78._0_4_)));
                auVar77 = vdpps_avx(auVar73,local_790,0x7f);
                auVar78 = vfnmadd231ss_fma(auVar76,auVar74,ZEXT416((uint)fVar231));
                auVar77 = vfnmadd231ss_fma(auVar77,auVar74,auVar75);
                auVar76 = vpermilps_avx(local_5e0._0_16_,0xff);
                fVar257 = fVar257 - auVar76._0_4_;
                auVar81 = vshufps_avx(auVar1,auVar1,0xff);
                auVar76 = vfmsub213ss_fma(auVar78,auVar79,auVar81);
                auVar254 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
                auVar248._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar248._8_4_ = auVar76._8_4_ ^ 0x80000000;
                auVar248._12_4_ = auVar76._12_4_ ^ 0x80000000;
                auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar79._0_4_));
                auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_)),
                                          ZEXT416((uint)fVar231),auVar77);
                auVar76 = vinsertps_avx(auVar248,auVar77,0x1c);
                auVar243._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                auVar243._8_4_ = auVar75._8_4_ ^ 0x80000000;
                auVar243._12_4_ = auVar75._12_4_ ^ 0x80000000;
                auVar77 = vinsertps_avx(ZEXT416((uint)fVar231),auVar243,0x10);
                auVar225._0_4_ = auVar78._0_4_;
                auVar225._4_4_ = auVar225._0_4_;
                auVar225._8_4_ = auVar225._0_4_;
                auVar225._12_4_ = auVar225._0_4_;
                auVar75 = vdivps_avx(auVar76,auVar225);
                auVar76 = vdivps_avx(auVar77,auVar225);
                auVar226._0_4_ = fVar256 * auVar75._0_4_ + fVar257 * auVar76._0_4_;
                auVar226._4_4_ = fVar256 * auVar75._4_4_ + fVar257 * auVar76._4_4_;
                auVar226._8_4_ = fVar256 * auVar75._8_4_ + fVar257 * auVar76._8_4_;
                auVar226._12_4_ = fVar256 * auVar75._12_4_ + fVar257 * auVar76._12_4_;
                auVar75 = vsubps_avx(auVar258,auVar226);
                auVar259 = ZEXT1664(auVar75);
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar76 = vandps_avx512vl(auVar74,auVar24);
                if (auVar76._0_4_ < auVar80._0_4_) {
                  auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar233._0_4_)),
                                            local_6b0,ZEXT416(0x36000000));
                  auVar25._8_4_ = 0x7fffffff;
                  auVar25._0_8_ = 0x7fffffff7fffffff;
                  auVar25._12_4_ = 0x7fffffff;
                  auVar77 = vandps_avx512vl(ZEXT416((uint)fVar257),auVar25);
                  if (auVar77._0_4_ < auVar76._0_4_) {
                    fVar255 = auVar75._0_4_ + (float)local_6c0._0_4_;
                    auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar255 < fVar149) {
                      bVar61 = 0;
                      goto LAB_01caeb7d;
                    }
                    fVar256 = *(float *)(ray + k * 4 + 0x100);
                    auVar254 = ZEXT464((uint)fVar256);
                    auVar250 = ZEXT3264(_local_7e0);
                    if (fVar255 <= fVar256) {
                      auVar76 = vmovshdup_avx(auVar75);
                      bVar61 = 0;
                      if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01caeb86;
                      auVar227._0_12_ = ZEXT812(0);
                      auVar227._12_4_ = 0;
                      auVar207._4_8_ = auVar227._4_8_;
                      auVar207._0_4_ = local_7c0._0_4_;
                      auVar207._12_4_ = 0;
                      auVar76 = vrsqrt14ss_avx512f(auVar227,auVar207);
                      fVar257 = auVar76._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar67].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar61 = 0;
                        goto LAB_01caeb86;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar61 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01caeb86;
                      fVar257 = fVar257 * 1.5 + local_7c0._0_4_ * -0.5 * fVar257 * fVar257 * fVar257
                      ;
                      auVar208._0_4_ = auVar73._0_4_ * fVar257;
                      auVar208._4_4_ = auVar73._4_4_ * fVar257;
                      auVar208._8_4_ = auVar73._8_4_ * fVar257;
                      auVar208._12_4_ = auVar73._12_4_ * fVar257;
                      auVar74 = vfmadd213ps_fma(auVar81,auVar208,auVar1);
                      auVar76 = vshufps_avx(auVar208,auVar208,0xc9);
                      auVar73 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar209._0_4_ = auVar208._0_4_ * auVar73._0_4_;
                      auVar209._4_4_ = auVar208._4_4_ * auVar73._4_4_;
                      auVar209._8_4_ = auVar208._8_4_ * auVar73._8_4_;
                      auVar209._12_4_ = auVar208._12_4_ * auVar73._12_4_;
                      auVar77 = vfmsub231ps_fma(auVar209,auVar1,auVar76);
                      auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                      auVar73 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                      auVar157._0_4_ = auVar74._0_4_ * auVar77._0_4_;
                      auVar157._4_4_ = auVar74._4_4_ * auVar77._4_4_;
                      auVar157._8_4_ = auVar74._8_4_ * auVar77._8_4_;
                      auVar157._12_4_ = auVar74._12_4_ * auVar77._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar157,auVar76,auVar73);
                      auVar230._8_4_ = 1;
                      auVar230._0_8_ = 0x100000001;
                      auVar230._12_4_ = 1;
                      auVar230._16_4_ = 1;
                      auVar230._20_4_ = 1;
                      auVar230._24_4_ = 1;
                      auVar230._28_4_ = 1;
                      local_420 = vpermps_avx2(auVar230,ZEXT1632(auVar75));
                      auVar84 = vpermps_avx2(auVar230,ZEXT1632(auVar76));
                      auVar240._8_4_ = 2;
                      auVar240._0_8_ = 0x200000002;
                      auVar240._12_4_ = 2;
                      auVar240._16_4_ = 2;
                      auVar240._20_4_ = 2;
                      auVar240._24_4_ = 2;
                      auVar240._28_4_ = 2;
                      local_460 = vpermps_avx2(auVar240,ZEXT1632(auVar76));
                      local_440 = auVar76._0_4_;
                      local_480[0] = (RTCHitN)auVar84[0];
                      local_480[1] = (RTCHitN)auVar84[1];
                      local_480[2] = (RTCHitN)auVar84[2];
                      local_480[3] = (RTCHitN)auVar84[3];
                      local_480[4] = (RTCHitN)auVar84[4];
                      local_480[5] = (RTCHitN)auVar84[5];
                      local_480[6] = (RTCHitN)auVar84[6];
                      local_480[7] = (RTCHitN)auVar84[7];
                      local_480[8] = (RTCHitN)auVar84[8];
                      local_480[9] = (RTCHitN)auVar84[9];
                      local_480[10] = (RTCHitN)auVar84[10];
                      local_480[0xb] = (RTCHitN)auVar84[0xb];
                      local_480[0xc] = (RTCHitN)auVar84[0xc];
                      local_480[0xd] = (RTCHitN)auVar84[0xd];
                      local_480[0xe] = (RTCHitN)auVar84[0xe];
                      local_480[0xf] = (RTCHitN)auVar84[0xf];
                      local_480[0x10] = (RTCHitN)auVar84[0x10];
                      local_480[0x11] = (RTCHitN)auVar84[0x11];
                      local_480[0x12] = (RTCHitN)auVar84[0x12];
                      local_480[0x13] = (RTCHitN)auVar84[0x13];
                      local_480[0x14] = (RTCHitN)auVar84[0x14];
                      local_480[0x15] = (RTCHitN)auVar84[0x15];
                      local_480[0x16] = (RTCHitN)auVar84[0x16];
                      local_480[0x17] = (RTCHitN)auVar84[0x17];
                      local_480[0x18] = (RTCHitN)auVar84[0x18];
                      local_480[0x19] = (RTCHitN)auVar84[0x19];
                      local_480[0x1a] = (RTCHitN)auVar84[0x1a];
                      local_480[0x1b] = (RTCHitN)auVar84[0x1b];
                      local_480[0x1c] = (RTCHitN)auVar84[0x1c];
                      local_480[0x1d] = (RTCHitN)auVar84[0x1d];
                      local_480[0x1e] = (RTCHitN)auVar84[0x1e];
                      local_480[0x1f] = (RTCHitN)auVar84[0x1f];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_400 = ZEXT432(0) << 0x20;
                      local_3e0 = local_4a0._0_8_;
                      uStack_3d8 = local_4a0._8_8_;
                      uStack_3d0 = local_4a0._16_8_;
                      uStack_3c8 = local_4a0._24_8_;
                      local_3c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_3a0 = context->user->instID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_380 = context->user->instPrimID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      *(float *)(ray + k * 4 + 0x100) = fVar255;
                      local_6e0 = local_500;
                      local_810.valid = (int *)local_6e0;
                      local_810.geometryUserPtr = pGVar3->userPtr;
                      local_810.context = context->user;
                      local_810.hit = local_480;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar259 = ZEXT1664(auVar75);
                        auVar263 = ZEXT1664(local_7c0._0_16_);
                        auVar266 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_810);
                        auVar250 = ZEXT3264(_local_7e0);
                        auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      }
                      if (local_6e0 != (undefined1  [32])0x0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar263 = ZEXT1664(auVar263._0_16_);
                          auVar266 = ZEXT1664(auVar266._0_16_);
                          (*p_Var4)(&local_810);
                          auVar250 = ZEXT3264(_local_7e0);
                          auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        }
                        auVar254 = ZEXT464((uint)fVar256);
                        uVar70 = vptestmd_avx512vl(local_6e0,local_6e0);
                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar70 & 1);
                        auVar140._0_4_ =
                             (uint)bVar5 * auVar84._0_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x100);
                        bVar5 = (bool)((byte)(uVar70 >> 1) & 1);
                        auVar140._4_4_ =
                             (uint)bVar5 * auVar84._4_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x104);
                        bVar5 = (bool)((byte)(uVar70 >> 2) & 1);
                        auVar140._8_4_ =
                             (uint)bVar5 * auVar84._8_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x108);
                        bVar5 = (bool)((byte)(uVar70 >> 3) & 1);
                        auVar140._12_4_ =
                             (uint)bVar5 * auVar84._12_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x10c);
                        bVar5 = (bool)((byte)(uVar70 >> 4) & 1);
                        auVar140._16_4_ =
                             (uint)bVar5 * auVar84._16_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x110);
                        bVar5 = (bool)((byte)(uVar70 >> 5) & 1);
                        auVar140._20_4_ =
                             (uint)bVar5 * auVar84._20_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x114);
                        bVar5 = (bool)((byte)(uVar70 >> 6) & 1);
                        auVar140._24_4_ =
                             (uint)bVar5 * auVar84._24_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x118);
                        bVar5 = SUB81(uVar70 >> 7,0);
                        auVar140._28_4_ =
                             (uint)bVar5 * auVar84._28_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x11c);
                        *(undefined1 (*) [32])(local_810.ray + 0x100) = auVar140;
                        bVar61 = 1;
                        if (local_6e0 != (undefined1  [32])0x0) goto LAB_01caeb86;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar256;
                    }
                    auVar254 = ZEXT464((uint)fVar256);
                    bVar61 = 0;
                    goto LAB_01caeb86;
                  }
                }
                bVar69 = uVar70 < 4;
                uVar70 = uVar70 + 1;
              } while (uVar70 != 5);
              bVar69 = false;
              auVar245 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar61 = 5;
LAB_01caeb7d:
              auVar250 = ZEXT3264(_local_7e0);
LAB_01caeb86:
              bVar68 = (bool)(bVar68 | bVar69 & bVar61);
              uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar163._4_4_ = uVar172;
              auVar163._0_4_ = uVar172;
              auVar163._8_4_ = uVar172;
              auVar163._12_4_ = uVar172;
              auVar163._16_4_ = uVar172;
              auVar163._20_4_ = uVar172;
              auVar163._24_4_ = uVar172;
              auVar163._28_4_ = uVar172;
              auVar53._4_4_ = fStack_53c;
              auVar53._0_4_ = local_540;
              auVar53._8_4_ = fStack_538;
              auVar53._12_4_ = fStack_534;
              auVar53._16_4_ = fStack_530;
              auVar53._20_4_ = fStack_52c;
              auVar53._24_4_ = fStack_528;
              auVar53._28_4_ = fStack_524;
              uVar16 = vcmpps_avx512vl(auVar163,auVar53,0xd);
              bVar56 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar56 & (byte)uVar16;
            } while (bVar56 != 0);
            auVar250 = ZEXT3264(local_360);
            auVar138 = local_560;
          }
          uVar17 = vpcmpgtd_avx512vl(auVar138,local_4e0);
          uVar18 = vpcmpd_avx512vl(local_4e0,local_300,1);
          auVar212._0_4_ = fVar165 + (float)local_1c0._0_4_;
          auVar212._4_4_ = fVar165 + (float)local_1c0._4_4_;
          auVar212._8_4_ = fVar165 + fStack_1b8;
          auVar212._12_4_ = fVar165 + fStack_1b4;
          auVar212._16_4_ = fVar165 + fStack_1b0;
          auVar212._20_4_ = fVar165 + fStack_1ac;
          auVar212._24_4_ = fVar165 + fStack_1a8;
          auVar212._28_4_ = fVar165 + fStack_1a4;
          uVar16 = vcmpps_avx512vl(auVar212,auVar163,2);
          bVar62 = bVar62 & (byte)uVar18 & (byte)uVar16;
          auVar213._0_4_ = fVar165 + auVar250._0_4_;
          auVar213._4_4_ = fVar165 + auVar250._4_4_;
          auVar213._8_4_ = fVar165 + auVar250._8_4_;
          auVar213._12_4_ = fVar165 + auVar250._12_4_;
          auVar213._16_4_ = fVar165 + auVar250._16_4_;
          auVar213._20_4_ = fVar165 + auVar250._20_4_;
          auVar213._24_4_ = fVar165 + auVar250._24_4_;
          auVar213._28_4_ = fVar165 + auVar250._28_4_;
          uVar16 = vcmpps_avx512vl(auVar213,auVar163,2);
          bVar56 = bVar64 & (byte)uVar17 & (byte)uVar16 | bVar62;
          prim = local_650;
          pPVar66 = local_658;
          if (bVar56 != 0) {
            abStack_180[uVar59 * 0x60] = bVar56;
            auVar141._0_4_ =
                 (uint)(bVar62 & 1) * local_1c0._0_4_ |
                 (uint)!(bool)(bVar62 & 1) * (int)auVar250._0_4_;
            bVar69 = (bool)(bVar62 >> 1 & 1);
            auVar141._4_4_ = (uint)bVar69 * local_1c0._4_4_ | (uint)!bVar69 * (int)auVar250._4_4_;
            bVar69 = (bool)(bVar62 >> 2 & 1);
            auVar141._8_4_ = (uint)bVar69 * (int)fStack_1b8 | (uint)!bVar69 * (int)auVar250._8_4_;
            bVar69 = (bool)(bVar62 >> 3 & 1);
            auVar141._12_4_ = (uint)bVar69 * (int)fStack_1b4 | (uint)!bVar69 * (int)auVar250._12_4_;
            bVar69 = (bool)(bVar62 >> 4 & 1);
            auVar141._16_4_ = (uint)bVar69 * (int)fStack_1b0 | (uint)!bVar69 * (int)auVar250._16_4_;
            bVar69 = (bool)(bVar62 >> 5 & 1);
            auVar141._20_4_ = (uint)bVar69 * (int)fStack_1ac | (uint)!bVar69 * (int)auVar250._20_4_;
            auVar141._24_4_ =
                 (uint)(bVar62 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar62 >> 6) * (int)auVar250._24_4_;
            auVar141._28_4_ = auVar250._28_4_;
            auVar250 = ZEXT3264(auVar141);
            *(undefined1 (*) [32])(auStack_160 + uVar59 * 0x60) = auVar141;
            uVar70 = vmovlps_avx(local_510);
            (&uStack_140)[uVar59 * 0xc] = uVar70;
            aiStack_138[uVar59 * 0x18] = iVar65 + 1;
            uVar59 = (ulong)((int)uVar59 + 1);
          }
        }
      }
    }
    do {
      uVar72 = (uint)uVar59;
      uVar59 = (ulong)(uVar72 - 1);
      if (uVar72 == 0) {
        if (bVar68 != false) {
          return bVar68;
        }
        uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar31._4_4_ = uVar172;
        auVar31._0_4_ = uVar172;
        auVar31._8_4_ = uVar172;
        auVar31._12_4_ = uVar172;
        auVar31._16_4_ = uVar172;
        auVar31._20_4_ = uVar172;
        auVar31._24_4_ = uVar172;
        auVar31._28_4_ = uVar172;
        uVar16 = vcmpps_avx512vl(local_2e0,auVar31,2);
        uVar67 = (uint)local_648 & (uint)uVar16;
        local_648 = (ulong)uVar67;
        if (uVar67 == 0) {
          return false;
        }
        goto LAB_01cac676;
      }
      lVar60 = uVar59 * 0x60;
      auVar84 = *(undefined1 (*) [32])(auStack_160 + lVar60);
      auVar184._0_4_ = fVar165 + auVar84._0_4_;
      auVar184._4_4_ = fVar165 + auVar84._4_4_;
      auVar184._8_4_ = fVar165 + auVar84._8_4_;
      auVar184._12_4_ = fVar165 + auVar84._12_4_;
      auVar184._16_4_ = fVar165 + auVar84._16_4_;
      auVar184._20_4_ = fVar165 + auVar84._20_4_;
      auVar184._24_4_ = fVar165 + auVar84._24_4_;
      auVar184._28_4_ = fVar165 + auVar84._28_4_;
      uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30._4_4_ = uVar172;
      auVar30._0_4_ = uVar172;
      auVar30._8_4_ = uVar172;
      auVar30._12_4_ = uVar172;
      auVar30._16_4_ = uVar172;
      auVar30._20_4_ = uVar172;
      auVar30._24_4_ = uVar172;
      auVar30._28_4_ = uVar172;
      uVar16 = vcmpps_avx512vl(auVar184,auVar30,2);
      uVar71 = (uint)uVar16 & (uint)abStack_180[lVar60];
    } while (uVar71 == 0);
    uVar70 = (&uStack_140)[uVar59 * 0xc];
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar70;
    auVar211._8_4_ = 0x7f800000;
    auVar211._0_8_ = 0x7f8000007f800000;
    auVar211._12_4_ = 0x7f800000;
    auVar211._16_4_ = 0x7f800000;
    auVar211._20_4_ = 0x7f800000;
    auVar211._24_4_ = 0x7f800000;
    auVar211._28_4_ = 0x7f800000;
    auVar85 = vblendmps_avx512vl(auVar211,auVar84);
    bVar56 = (byte)uVar71;
    auVar136._0_4_ =
         (uint)(bVar56 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)auVar84._0_4_;
    bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
    auVar136._4_4_ = (uint)bVar69 * auVar85._4_4_ | (uint)!bVar69 * (int)auVar84._4_4_;
    bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
    auVar136._8_4_ = (uint)bVar69 * auVar85._8_4_ | (uint)!bVar69 * (int)auVar84._8_4_;
    bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
    auVar136._12_4_ = (uint)bVar69 * auVar85._12_4_ | (uint)!bVar69 * (int)auVar84._12_4_;
    bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
    auVar136._16_4_ = (uint)bVar69 * auVar85._16_4_ | (uint)!bVar69 * (int)auVar84._16_4_;
    bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
    auVar136._20_4_ = (uint)bVar69 * auVar85._20_4_ | (uint)!bVar69 * (int)auVar84._20_4_;
    bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
    auVar136._24_4_ = (uint)bVar69 * auVar85._24_4_ | (uint)!bVar69 * (int)auVar84._24_4_;
    auVar136._28_4_ =
         (uVar71 >> 7) * auVar85._28_4_ | (uint)!SUB41(uVar71 >> 7,0) * (int)auVar84._28_4_;
    auVar84 = vshufps_avx(auVar136,auVar136,0xb1);
    auVar84 = vminps_avx(auVar136,auVar84);
    auVar85 = vshufpd_avx(auVar84,auVar84,5);
    auVar84 = vminps_avx(auVar84,auVar85);
    auVar85 = vpermpd_avx2(auVar84,0x4e);
    auVar84 = vminps_avx(auVar84,auVar85);
    uVar16 = vcmpps_avx512vl(auVar136,auVar84,0);
    bVar61 = (byte)uVar16 & bVar56;
    if (bVar61 != 0) {
      uVar71 = (uint)bVar61;
    }
    uVar142 = 0;
    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
      uVar142 = uVar142 + 1;
    }
    iVar65 = aiStack_138[uVar59 * 0x18];
    bVar56 = ~('\x01' << ((byte)uVar142 & 0x1f)) & bVar56;
    abStack_180[lVar60] = bVar56;
    if (bVar56 == 0) {
      uVar72 = uVar72 - 1;
    }
    uVar172 = (undefined4)uVar70;
    auVar160._4_4_ = uVar172;
    auVar160._0_4_ = uVar172;
    auVar160._8_4_ = uVar172;
    auVar160._12_4_ = uVar172;
    auVar160._16_4_ = uVar172;
    auVar160._20_4_ = uVar172;
    auVar160._24_4_ = uVar172;
    auVar160._28_4_ = uVar172;
    auVar75 = vmovshdup_avx(auVar173);
    auVar75 = vsubps_avx(auVar75,auVar173);
    auVar185._0_4_ = auVar75._0_4_;
    auVar185._4_4_ = auVar185._0_4_;
    auVar185._8_4_ = auVar185._0_4_;
    auVar185._12_4_ = auVar185._0_4_;
    auVar185._16_4_ = auVar185._0_4_;
    auVar185._20_4_ = auVar185._0_4_;
    auVar185._24_4_ = auVar185._0_4_;
    auVar185._28_4_ = auVar185._0_4_;
    auVar75 = vfmadd132ps_fma(auVar185,auVar160,_DAT_01faff20);
    auVar84 = ZEXT1632(auVar75);
    local_480[0] = (RTCHitN)auVar84[0];
    local_480[1] = (RTCHitN)auVar84[1];
    local_480[2] = (RTCHitN)auVar84[2];
    local_480[3] = (RTCHitN)auVar84[3];
    local_480[4] = (RTCHitN)auVar84[4];
    local_480[5] = (RTCHitN)auVar84[5];
    local_480[6] = (RTCHitN)auVar84[6];
    local_480[7] = (RTCHitN)auVar84[7];
    local_480[8] = (RTCHitN)auVar84[8];
    local_480[9] = (RTCHitN)auVar84[9];
    local_480[10] = (RTCHitN)auVar84[10];
    local_480[0xb] = (RTCHitN)auVar84[0xb];
    local_480[0xc] = (RTCHitN)auVar84[0xc];
    local_480[0xd] = (RTCHitN)auVar84[0xd];
    local_480[0xe] = (RTCHitN)auVar84[0xe];
    local_480[0xf] = (RTCHitN)auVar84[0xf];
    local_480[0x10] = (RTCHitN)auVar84[0x10];
    local_480[0x11] = (RTCHitN)auVar84[0x11];
    local_480[0x12] = (RTCHitN)auVar84[0x12];
    local_480[0x13] = (RTCHitN)auVar84[0x13];
    local_480[0x14] = (RTCHitN)auVar84[0x14];
    local_480[0x15] = (RTCHitN)auVar84[0x15];
    local_480[0x16] = (RTCHitN)auVar84[0x16];
    local_480[0x17] = (RTCHitN)auVar84[0x17];
    local_480[0x18] = (RTCHitN)auVar84[0x18];
    local_480[0x19] = (RTCHitN)auVar84[0x19];
    local_480[0x1a] = (RTCHitN)auVar84[0x1a];
    local_480[0x1b] = (RTCHitN)auVar84[0x1b];
    local_480[0x1c] = (RTCHitN)auVar84[0x1c];
    local_480[0x1d] = (RTCHitN)auVar84[0x1d];
    local_480[0x1e] = (RTCHitN)auVar84[0x1e];
    local_480[0x1f] = (RTCHitN)auVar84[0x1f];
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_480 + (ulong)uVar142 * 4);
    uVar59 = (ulong)uVar72;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }